

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  ulong uVar60;
  RayK<16> *pRVar61;
  byte bVar62;
  bool bVar63;
  ulong uVar64;
  uint uVar65;
  Geometry *geometry;
  long lVar66;
  ulong uVar67;
  float fVar68;
  float fVar118;
  float fVar120;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar79 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar69;
  undefined1 auVar80 [16];
  float fVar119;
  float fVar121;
  float fVar123;
  float fVar124;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar122;
  float fVar125;
  float fVar126;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined4 uVar127;
  vint4 bi_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined8 uVar136;
  vint4 bi_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar142 [64];
  float fVar143;
  float fVar154;
  vint4 ai_2;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  float fVar155;
  float fVar162;
  float fVar163;
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar164;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [64];
  vint4 ai_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  uint uVar180;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [64];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  bool local_9d9;
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [16];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined8 uStack_8f8;
  ulong local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  LinearSpace3fa *local_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined4 local_740;
  int local_73c;
  undefined1 local_730 [16];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  byte local_6f0;
  float local_6e0 [4];
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [64];
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 auStack_4a0 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar8 = prim[1];
  uVar60 = (ulong)(byte)PVar8;
  fVar155 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar77 = vsubps_avx(auVar77,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar144._0_4_ = fVar155 * auVar77._0_4_;
  auVar144._4_4_ = fVar155 * auVar77._4_4_;
  auVar144._8_4_ = fVar155 * auVar77._8_4_;
  auVar144._12_4_ = fVar155 * auVar77._12_4_;
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar80._0_4_ = fVar155 * auVar75._0_4_;
  auVar80._4_4_ = fVar155 * auVar75._4_4_;
  auVar80._8_4_ = fVar155 * auVar75._8_4_;
  auVar80._12_4_ = fVar155 * auVar75._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar60 + 6)));
  uVar67 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + uVar60 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar64 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar183._4_4_ = auVar80._0_4_;
  auVar183._0_4_ = auVar80._0_4_;
  auVar183._8_4_ = auVar80._0_4_;
  auVar183._12_4_ = auVar80._0_4_;
  auVar21 = vshufps_avx(auVar80,auVar80,0x55);
  auVar79 = vshufps_avx(auVar80,auVar80,0xaa);
  fVar155 = auVar79._0_4_;
  auVar156._0_4_ = fVar155 * auVar70._0_4_;
  fVar162 = auVar79._4_4_;
  auVar156._4_4_ = fVar162 * auVar70._4_4_;
  fVar163 = auVar79._8_4_;
  auVar156._8_4_ = fVar163 * auVar70._8_4_;
  fVar164 = auVar79._12_4_;
  auVar156._12_4_ = fVar164 * auVar70._12_4_;
  auVar137._0_4_ = auVar71._0_4_ * fVar155;
  auVar137._4_4_ = auVar71._4_4_ * fVar162;
  auVar137._8_4_ = auVar71._8_4_ * fVar163;
  auVar137._12_4_ = auVar71._12_4_ * fVar164;
  auVar128._0_4_ = auVar72._0_4_ * fVar155;
  auVar128._4_4_ = auVar72._4_4_ * fVar162;
  auVar128._8_4_ = auVar72._8_4_ * fVar163;
  auVar128._12_4_ = auVar72._12_4_ * fVar164;
  auVar79 = vfmadd231ps_fma(auVar156,auVar21,auVar75);
  auVar74 = vfmadd231ps_fma(auVar137,auVar21,auVar19);
  auVar21 = vfmadd231ps_fma(auVar128,auVar20,auVar21);
  auVar73 = vfmadd231ps_fma(auVar79,auVar183,auVar77);
  auVar74 = vfmadd231ps_fma(auVar74,auVar183,auVar76);
  auVar80 = vfmadd231ps_fma(auVar21,auVar78,auVar183);
  auVar184._4_4_ = auVar144._0_4_;
  auVar184._0_4_ = auVar144._0_4_;
  auVar184._8_4_ = auVar144._0_4_;
  auVar184._12_4_ = auVar144._0_4_;
  auVar21 = vshufps_avx(auVar144,auVar144,0x55);
  auVar79 = vshufps_avx(auVar144,auVar144,0xaa);
  auVar70 = vmulps_avx512vl(auVar79,auVar70);
  auVar145._0_4_ = auVar79._0_4_ * auVar71._0_4_;
  auVar145._4_4_ = auVar79._4_4_ * auVar71._4_4_;
  auVar145._8_4_ = auVar79._8_4_ * auVar71._8_4_;
  auVar145._12_4_ = auVar79._12_4_ * auVar71._12_4_;
  auVar139._0_4_ = auVar79._0_4_ * auVar72._0_4_;
  auVar139._4_4_ = auVar79._4_4_ * auVar72._4_4_;
  auVar139._8_4_ = auVar79._8_4_ * auVar72._8_4_;
  auVar139._12_4_ = auVar79._12_4_ * auVar72._12_4_;
  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar21,auVar75);
  auVar75 = vfmadd231ps_fma(auVar145,auVar21,auVar19);
  auVar70 = vfmadd231ps_fma(auVar139,auVar21,auVar20);
  auVar72 = vfmadd231ps_avx512vl(auVar71,auVar184,auVar77);
  auVar71 = vfmadd231ps_fma(auVar75,auVar184,auVar76);
  auVar20 = vfmadd231ps_fma(auVar70,auVar184,auVar78);
  auVar173._8_4_ = 0x7fffffff;
  auVar173._0_8_ = 0x7fffffff7fffffff;
  auVar173._12_4_ = 0x7fffffff;
  auVar77 = vandps_avx(auVar73,auVar173);
  auVar170._8_4_ = 0x219392ef;
  auVar170._0_8_ = 0x219392ef219392ef;
  auVar170._12_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar77,auVar170,1);
  bVar63 = (bool)((byte)uVar67 & 1);
  auVar79._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._0_4_;
  bVar63 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._4_4_;
  bVar63 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._8_4_;
  bVar63 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar73._12_4_;
  auVar77 = vandps_avx(auVar74,auVar173);
  uVar67 = vcmpps_avx512vl(auVar77,auVar170,1);
  bVar63 = (bool)((byte)uVar67 & 1);
  auVar73._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar74._0_4_;
  bVar63 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar74._4_4_;
  bVar63 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar74._8_4_;
  bVar63 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar74._12_4_;
  auVar77 = vandps_avx(auVar80,auVar173);
  uVar67 = vcmpps_avx512vl(auVar77,auVar170,1);
  bVar63 = (bool)((byte)uVar67 & 1);
  auVar74._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar80._0_4_;
  bVar63 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar80._4_4_;
  bVar63 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar80._8_4_;
  bVar63 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar80._12_4_;
  auVar75 = vrcp14ps_avx512vl(auVar79);
  auVar171._8_4_ = 0x3f800000;
  auVar171._0_8_ = &DAT_3f8000003f800000;
  auVar171._12_4_ = 0x3f800000;
  auVar77 = vfnmadd213ps_fma(auVar79,auVar75,auVar171);
  auVar70 = vfmadd132ps_fma(auVar77,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar73);
  auVar77 = vfnmadd213ps_fma(auVar73,auVar75,auVar171);
  auVar19 = vfmadd132ps_fma(auVar77,auVar75,auVar75);
  auVar75 = vrcp14ps_avx512vl(auVar74);
  auVar77 = vfnmadd213ps_fma(auVar74,auVar75,auVar171);
  auVar78 = vfmadd132ps_fma(auVar77,auVar75,auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar76 = vsubps_avx512vl(auVar77,auVar72);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar77 = vpmovsxwd_avx(auVar75);
  auVar165._0_4_ = auVar70._0_4_ * auVar76._0_4_;
  auVar165._4_4_ = auVar70._4_4_ * auVar76._4_4_;
  auVar165._8_4_ = auVar70._8_4_ * auVar76._8_4_;
  auVar165._12_4_ = auVar70._12_4_ * auVar76._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx512vl(auVar77,auVar72);
  auVar157._0_4_ = auVar70._0_4_ * auVar77._0_4_;
  auVar157._4_4_ = auVar70._4_4_ * auVar77._4_4_;
  auVar157._8_4_ = auVar70._8_4_ * auVar77._8_4_;
  auVar157._12_4_ = auVar70._12_4_ * auVar77._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar75 = vpmovsxwd_avx(auVar70);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar60 * -2 + 6);
  auVar77 = vpmovsxwd_avx(auVar76);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar71);
  auVar174._0_4_ = auVar19._0_4_ * auVar77._0_4_;
  auVar174._4_4_ = auVar19._4_4_ * auVar77._4_4_;
  auVar174._8_4_ = auVar19._8_4_ * auVar77._8_4_;
  auVar174._12_4_ = auVar19._12_4_ * auVar77._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar75);
  auVar77 = vsubps_avx(auVar77,auVar71);
  auVar138._0_4_ = auVar19._0_4_ * auVar77._0_4_;
  auVar138._4_4_ = auVar19._4_4_ * auVar77._4_4_;
  auVar138._8_4_ = auVar19._8_4_ * auVar77._8_4_;
  auVar138._12_4_ = auVar19._12_4_ * auVar77._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar64 + uVar60 + 6);
  auVar77 = vpmovsxwd_avx(auVar19);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar20);
  auVar146._0_4_ = auVar78._0_4_ * auVar77._0_4_;
  auVar146._4_4_ = auVar78._4_4_ * auVar77._4_4_;
  auVar146._8_4_ = auVar78._8_4_ * auVar77._8_4_;
  auVar146._12_4_ = auVar78._12_4_ * auVar77._12_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar77 = vpmovsxwd_avx(auVar71);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar20);
  auVar129._0_4_ = auVar78._0_4_ * auVar77._0_4_;
  auVar129._4_4_ = auVar78._4_4_ * auVar77._4_4_;
  auVar129._8_4_ = auVar78._8_4_ * auVar77._8_4_;
  auVar129._12_4_ = auVar78._12_4_ * auVar77._12_4_;
  auVar77 = vpminsd_avx(auVar165,auVar157);
  auVar75 = vpminsd_avx(auVar174,auVar138);
  auVar77 = vmaxps_avx(auVar77,auVar75);
  auVar75 = vpminsd_avx(auVar146,auVar129);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar78._4_4_ = uVar127;
  auVar78._0_4_ = uVar127;
  auVar78._8_4_ = uVar127;
  auVar78._12_4_ = uVar127;
  auVar75 = vmaxps_avx512vl(auVar75,auVar78);
  auVar77 = vmaxps_avx(auVar77,auVar75);
  auVar20._8_4_ = 0x3f7ffffa;
  auVar20._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar20._12_4_ = 0x3f7ffffa;
  local_5b0 = vmulps_avx512vl(auVar77,auVar20);
  auVar172 = ZEXT1664(local_5b0);
  auVar77 = vpmaxsd_avx(auVar165,auVar157);
  auVar142 = ZEXT1664(auVar77);
  auVar75 = vpmaxsd_avx(auVar174,auVar138);
  auVar77 = vminps_avx(auVar77,auVar75);
  auVar75 = vpmaxsd_avx(auVar146,auVar129);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar72._4_4_ = uVar127;
  auVar72._0_4_ = uVar127;
  auVar72._8_4_ = uVar127;
  auVar72._12_4_ = uVar127;
  auVar75 = vminps_avx512vl(auVar75,auVar72);
  auVar77 = vminps_avx(auVar77,auVar75);
  auVar21._8_4_ = 0x3f800003;
  auVar21._0_8_ = 0x3f8000033f800003;
  auVar21._12_4_ = 0x3f800003;
  auVar77 = vmulps_avx512vl(auVar77,auVar21);
  auVar75 = vpbroadcastd_avx512vl();
  uVar136 = vcmpps_avx512vl(local_5b0,auVar77,2);
  uVar67 = vpcmpgtd_avx512vl(auVar75,_DAT_01ff0cf0);
  uVar67 = ((byte)uVar136 & 0xf) & uVar67;
  local_9d9 = (char)uVar67 != '\0';
  if (local_9d9) {
    local_868 = pre->ray_space + k;
    auVar135 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar135);
    do {
      auVar135 = local_500;
      auVar141 = auVar172._0_32_;
      auVar108 = auVar142._0_32_;
      local_820 = in_ZMM20._0_32_;
      lVar23 = 0;
      for (uVar60 = uVar67; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar65 = *(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[uVar65].ptr;
      uVar60 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar23 * 4 + 6));
      p_Var11 = pGVar10[1].intersectionFilterN;
      lVar23 = *(long *)&pGVar10[1].time_range.upper;
      auVar77 = *(undefined1 (*) [16])(lVar23 + (long)p_Var11 * uVar60);
      pauVar3 = (undefined1 (*) [16])(lVar23 + (uVar60 + 1) * (long)p_Var11);
      local_8f0 = *(ulong *)*pauVar3;
      uStack_8c8 = *(undefined8 *)(*pauVar3 + 8);
      auVar75 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar23 + (uVar60 + 2) * (long)p_Var11);
      local_8e0 = *(undefined8 *)*pauVar4;
      uStack_8d8 = *(undefined8 *)(*pauVar4 + 8);
      auVar70 = *pauVar4;
      uVar67 = uVar67 - 1 & uVar67;
      pauVar5 = (undefined1 (*) [16])(lVar23 + (uVar60 + 3) * (long)p_Var11);
      local_880 = *(undefined8 *)*pauVar5;
      uStack_878 = *(undefined8 *)(*pauVar5 + 8);
      auVar76 = *pauVar5;
      if (uVar67 != 0) {
        uVar64 = uVar67 - 1 & uVar67;
        for (uVar60 = uVar67; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        }
        if (uVar64 != 0) {
          for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar78 = vsubps_avx(auVar77,auVar19);
      uVar127 = auVar78._0_4_;
      auVar140._4_4_ = uVar127;
      auVar140._0_4_ = uVar127;
      auVar140._8_4_ = uVar127;
      auVar140._12_4_ = uVar127;
      auVar71 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      aVar6 = (local_868->vx).field_0;
      aVar7 = (local_868->vy).field_0;
      fVar155 = (local_868->vz).field_0.m128[0];
      fVar162 = *(float *)((long)&(local_868->vz).field_0 + 4);
      fVar163 = *(float *)((long)&(local_868->vz).field_0 + 8);
      fVar164 = *(float *)((long)&(local_868->vz).field_0 + 0xc);
      auVar177._0_4_ = fVar155 * auVar78._0_4_;
      auVar177._4_4_ = fVar162 * auVar78._4_4_;
      auVar177._8_4_ = fVar163 * auVar78._8_4_;
      auVar177._12_4_ = fVar164 * auVar78._12_4_;
      auVar71 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar7,auVar71);
      auVar72 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar6,auVar140);
      auVar71 = vshufps_avx(auVar77,auVar77,0xff);
      auVar20 = vsubps_avx(auVar75,auVar19);
      uVar127 = auVar20._0_4_;
      auVar147._4_4_ = uVar127;
      auVar147._0_4_ = uVar127;
      auVar147._8_4_ = uVar127;
      auVar147._12_4_ = uVar127;
      auVar78 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar178._0_4_ = fVar155 * auVar20._0_4_;
      auVar178._4_4_ = fVar162 * auVar20._4_4_;
      auVar178._8_4_ = fVar163 * auVar20._8_4_;
      auVar178._12_4_ = fVar164 * auVar20._12_4_;
      auVar78 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar7,auVar78);
      auVar21 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar6,auVar147);
      auVar75 = vshufps_avx(auVar75,auVar75,0xff);
      auVar20 = vsubps_avx(auVar70,auVar19);
      uVar127 = auVar20._0_4_;
      auVar175._4_4_ = uVar127;
      auVar175._0_4_ = uVar127;
      auVar175._8_4_ = uVar127;
      auVar175._12_4_ = uVar127;
      auVar78 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar181._0_4_ = fVar155 * auVar20._0_4_;
      auVar181._4_4_ = fVar162 * auVar20._4_4_;
      auVar181._8_4_ = fVar163 * auVar20._8_4_;
      auVar181._12_4_ = fVar164 * auVar20._12_4_;
      auVar78 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar7,auVar78);
      auVar20 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar6,auVar175);
      auVar70 = vshufps_avx(auVar70,auVar70,0xff);
      auVar78 = vsubps_avx512vl(auVar76,auVar19);
      uVar127 = auVar78._0_4_;
      auVar148._4_4_ = uVar127;
      auVar148._0_4_ = uVar127;
      auVar148._8_4_ = uVar127;
      auVar148._12_4_ = uVar127;
      auVar19 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar182._0_4_ = fVar155 * auVar78._0_4_;
      auVar182._4_4_ = fVar162 * auVar78._4_4_;
      auVar182._8_4_ = fVar163 * auVar78._8_4_;
      auVar182._12_4_ = fVar164 * auVar78._12_4_;
      auVar19 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar7,auVar19);
      auVar19 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar148);
      lVar23 = (long)iVar9 * 0x44;
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23);
      auVar78 = vshufps_avx512vl(auVar76,auVar76,0xff);
      local_7e0 = vbroadcastss_avx512vl(auVar72);
      auVar81._8_4_ = 1;
      auVar81._0_8_ = 0x100000001;
      auVar81._12_4_ = 1;
      auVar81._16_4_ = 1;
      auVar81._20_4_ = 1;
      auVar81._24_4_ = 1;
      auVar81._28_4_ = 1;
      local_8a0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar72));
      uVar136 = auVar71._0_8_;
      local_320._8_8_ = uVar136;
      local_320._0_8_ = uVar136;
      local_320._16_8_ = uVar136;
      local_320._24_8_ = uVar136;
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x484);
      uVar127 = auVar21._0_4_;
      local_8c0._4_4_ = uVar127;
      local_8c0._0_4_ = uVar127;
      local_8c0._8_4_ = uVar127;
      local_8c0._12_4_ = uVar127;
      local_8c0._16_4_ = uVar127;
      local_8c0._20_4_ = uVar127;
      local_8c0._24_4_ = uVar127;
      local_8c0._28_4_ = uVar127;
      local_5a0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar21));
      uVar136 = auVar75._0_8_;
      local_340._8_8_ = uVar136;
      local_340._0_8_ = uVar136;
      local_340._16_8_ = uVar136;
      local_340._24_8_ = uVar136;
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar20);
      local_380 = vpermps_avx512vl(auVar81,ZEXT1632(auVar20));
      local_3a0 = vbroadcastsd_avx512vl(auVar70);
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0xd8c);
      local_3c0 = vbroadcastss_avx512vl(auVar19);
      local_3e0 = vpermps_avx512vl(auVar81,ZEXT1632(auVar19));
      _local_400 = vbroadcastsd_avx512vl(auVar78);
      auVar81 = vmulps_avx512vl(local_3c0,auVar95);
      auVar82 = vmulps_avx512vl(local_3e0,auVar95);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar96,local_360);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar96,local_380);
      auVar75 = vfmadd231ps_fma(auVar81,auVar99,local_8c0);
      auVar83 = vfmadd231ps_avx512vl(auVar82,auVar99,local_5a0);
      auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar97,local_7e0);
      auVar81 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23);
      auVar82 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x484);
      auVar85 = vfmadd231ps_avx512vl(auVar83,auVar97,local_8a0);
      auVar83 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x908);
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0xd8c);
      auVar86 = vmulps_avx512vl(local_3c0,auVar94);
      auVar87 = vmulps_avx512vl(local_3e0,auVar94);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar83,local_360);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,local_380);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_8c0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar82,local_5a0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,local_7e0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar81,local_8a0);
      auVar88 = vsubps_avx512vl(auVar86,auVar84);
      auVar89 = vsubps_avx512vl(auVar87,auVar85);
      auVar90 = vmulps_avx512vl(auVar85,auVar88);
      auVar91 = vmulps_avx512vl(auVar84,auVar89);
      auVar90 = vsubps_avx512vl(auVar90,auVar91);
      auVar91 = vmulps_avx512vl(_local_400,auVar95);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_3a0);
      auVar75 = vfmadd231ps_fma(auVar91,auVar99,local_340);
      auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar97,local_320);
      auVar92 = vmulps_avx512vl(_local_400,auVar94);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar83,local_3a0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar82,local_340);
      auVar71 = vfmadd231ps_fma(auVar92,auVar81,local_320);
      auVar92 = vmulps_avx512vl(auVar89,auVar89);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,auVar88);
      auVar93 = vmaxps_avx512vl(auVar91,ZEXT1632(auVar71));
      auVar93 = vmulps_avx512vl(auVar93,auVar93);
      auVar92 = vmulps_avx512vl(auVar93,auVar92);
      auVar90 = vmulps_avx512vl(auVar90,auVar90);
      uVar136 = vcmpps_avx512vl(auVar90,auVar92,2);
      auVar75 = vblendps_avx(auVar72,auVar77,8);
      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar70 = vandps_avx512vl(auVar75,auVar78);
      auVar75 = vblendps_avx(auVar21,*pauVar3,8);
      auVar75 = vandps_avx512vl(auVar75,auVar78);
      auVar70 = vmaxps_avx(auVar70,auVar75);
      auVar75 = vblendps_avx(auVar20,*pauVar4,8);
      auVar79 = vandps_avx512vl(auVar75,auVar78);
      auVar75 = vblendps_avx(auVar19,auVar76,8);
      auVar75 = vandps_avx512vl(auVar75,auVar78);
      auVar75 = vmaxps_avx(auVar79,auVar75);
      auVar75 = vmaxps_avx(auVar70,auVar75);
      auVar70 = vmovshdup_avx(auVar75);
      auVar70 = vmaxss_avx(auVar70,auVar75);
      auVar75 = vshufpd_avx(auVar75,auVar75,1);
      auVar75 = vmaxss_avx(auVar75,auVar70);
      auVar92._0_4_ = (float)iVar9;
      local_500._4_12_ = auVar72._4_12_;
      local_500._0_4_ = auVar92._0_4_;
      local_500._16_48_ = auVar135._16_48_;
      auVar92._4_4_ = auVar92._0_4_;
      auVar92._8_4_ = auVar92._0_4_;
      auVar92._12_4_ = auVar92._0_4_;
      auVar92._16_4_ = auVar92._0_4_;
      auVar92._20_4_ = auVar92._0_4_;
      auVar92._24_4_ = auVar92._0_4_;
      auVar92._28_4_ = auVar92._0_4_;
      uVar22 = vcmpps_avx512vl(auVar92,_DAT_02020f40,0xe);
      local_6f0 = (byte)uVar136 & (byte)uVar22;
      local_7c0 = auVar75._0_4_ * 4.7683716e-07;
      auVar90._8_4_ = 2;
      auVar90._0_8_ = 0x200000002;
      auVar90._12_4_ = 2;
      auVar90._16_4_ = 2;
      auVar90._20_4_ = 2;
      auVar90._24_4_ = 2;
      auVar90._28_4_ = 2;
      local_420 = vpermps_avx512vl(auVar90,ZEXT1632(auVar72));
      local_440 = vpermps_avx512vl(auVar90,ZEXT1632(auVar21));
      local_460 = vpermps_avx512vl(auVar90,ZEXT1632(auVar20));
      local_800 = vpermps_avx2(auVar90,ZEXT1632(auVar19));
      uVar180 = *(uint *)(ray + k * 4 + 0xc0);
      auVar75 = local_380._0_16_;
      local_920 = ZEXT416((uint)local_7c0);
      local_8d0 = local_8f0;
      if (local_6f0 == 0) {
        bVar63 = false;
        auVar75 = vxorps_avx512vl(auVar75,auVar75);
        auVar191 = ZEXT1664(auVar75);
        auVar172 = ZEXT3264(auVar141);
        in_ZMM20 = ZEXT3264(local_820);
        auVar142 = ZEXT3264(auVar108);
        auVar189 = ZEXT3264(local_840);
        auVar190 = ZEXT3264(local_7e0);
        auVar188 = ZEXT3264(local_8a0);
        auVar135 = ZEXT3264(local_8c0);
      }
      else {
        local_860._0_16_ = ZEXT416(uVar180);
        auVar94 = vmulps_avx512vl(local_800,auVar94);
        auVar83 = vfmadd213ps_avx512vl(auVar83,local_460,auVar94);
        auVar82 = vfmadd213ps_avx512vl(auVar82,local_440,auVar83);
        auVar90 = vfmadd213ps_avx512vl(auVar81,local_420,auVar82);
        auVar95 = vmulps_avx512vl(local_800,auVar95);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_460,auVar95);
        auVar82 = vfmadd213ps_avx512vl(auVar99,local_440,auVar96);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1210);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1694);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1b18);
        auVar81 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1f9c);
        auVar93 = vfmadd213ps_avx512vl(auVar97,local_420,auVar82);
        auVar82 = vmulps_avx512vl(local_3c0,auVar81);
        auVar83 = vmulps_avx512vl(local_3e0,auVar81);
        auVar97._4_4_ = local_800._4_4_ * auVar81._4_4_;
        auVar97._0_4_ = local_800._0_4_ * auVar81._0_4_;
        auVar97._8_4_ = local_800._8_4_ * auVar81._8_4_;
        auVar97._12_4_ = local_800._12_4_ * auVar81._12_4_;
        auVar97._16_4_ = local_800._16_4_ * auVar81._16_4_;
        auVar97._20_4_ = local_800._20_4_ * auVar81._20_4_;
        auVar97._24_4_ = local_800._24_4_ * auVar81._24_4_;
        auVar97._28_4_ = auVar81._28_4_;
        auVar81 = vfmadd231ps_avx512vl(auVar82,auVar95,local_360);
        auVar82 = vfmadd231ps_avx512vl(auVar83,auVar95,local_380);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_460,auVar95);
        auVar95 = vfmadd231ps_avx512vl(auVar81,auVar96,local_8c0);
        auVar81 = vfmadd231ps_avx512vl(auVar82,auVar96,local_5a0);
        auVar82 = vfmadd231ps_avx512vl(auVar97,local_440,auVar96);
        auVar83 = vfmadd231ps_avx512vl(auVar95,auVar99,local_7e0);
        auVar188 = ZEXT3264(local_8a0);
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar99,local_8a0);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1210);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1f9c);
        auVar82 = vfmadd231ps_avx512vl(auVar82,local_420,auVar99);
        auVar94 = vmulps_avx512vl(local_3c0,auVar95);
        auVar98 = vmulps_avx512vl(local_3e0,auVar95);
        auVar99._4_4_ = local_800._4_4_ * auVar95._4_4_;
        auVar99._0_4_ = local_800._0_4_ * auVar95._0_4_;
        auVar99._8_4_ = local_800._8_4_ * auVar95._8_4_;
        auVar99._12_4_ = local_800._12_4_ * auVar95._12_4_;
        auVar99._16_4_ = local_800._16_4_ * auVar95._16_4_;
        auVar99._20_4_ = local_800._20_4_ * auVar95._20_4_;
        auVar99._24_4_ = local_800._24_4_ * auVar95._24_4_;
        auVar99._28_4_ = auVar95._28_4_;
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar96,local_360);
        auVar94 = vfmadd231ps_avx512vl(auVar98,auVar96,local_380);
        auVar96 = vfmadd231ps_avx512vl(auVar99,local_460,auVar96);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1694);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,local_8c0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,local_5a0);
        auVar99 = vfmadd231ps_avx512vl(auVar96,local_440,auVar99);
        auVar96 = vfmadd231ps_avx512vl(auVar95,auVar97,local_7e0);
        auVar95 = vfmadd231ps_avx512vl(auVar94,auVar97,local_8a0);
        auVar94 = vfmadd231ps_avx512vl(auVar99,local_420,auVar97);
        auVar186._8_4_ = 0x7fffffff;
        auVar186._0_8_ = 0x7fffffff7fffffff;
        auVar186._12_4_ = 0x7fffffff;
        auVar186._16_4_ = 0x7fffffff;
        auVar186._20_4_ = 0x7fffffff;
        auVar186._24_4_ = 0x7fffffff;
        auVar186._28_4_ = 0x7fffffff;
        auVar97 = vandps_avx(auVar83,auVar186);
        auVar99 = vandps_avx(auVar81,auVar186);
        auVar99 = vmaxps_avx(auVar97,auVar99);
        auVar97 = vandps_avx(auVar82,auVar186);
        auVar97 = vmaxps_avx(auVar99,auVar97);
        auVar82 = vbroadcastss_avx512vl(local_920);
        uVar60 = vcmpps_avx512vl(auVar97,auVar82,1);
        bVar63 = (bool)((byte)uVar60 & 1);
        auVar98._0_4_ = (float)((uint)bVar63 * auVar88._0_4_ | (uint)!bVar63 * auVar83._0_4_);
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar63 * auVar88._4_4_ | (uint)!bVar63 * auVar83._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar63 * auVar88._8_4_ | (uint)!bVar63 * auVar83._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar63 * auVar88._12_4_ | (uint)!bVar63 * auVar83._12_4_);
        bVar63 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar98._16_4_ = (float)((uint)bVar63 * auVar88._16_4_ | (uint)!bVar63 * auVar83._16_4_);
        bVar63 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar98._20_4_ = (float)((uint)bVar63 * auVar88._20_4_ | (uint)!bVar63 * auVar83._20_4_);
        bVar63 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar98._24_4_ = (float)((uint)bVar63 * auVar88._24_4_ | (uint)!bVar63 * auVar83._24_4_);
        bVar63 = SUB81(uVar60 >> 7,0);
        auVar98._28_4_ = (uint)bVar63 * auVar88._28_4_ | (uint)!bVar63 * auVar83._28_4_;
        bVar63 = (bool)((byte)uVar60 & 1);
        auVar100._0_4_ = (float)((uint)bVar63 * auVar89._0_4_ | (uint)!bVar63 * auVar81._0_4_);
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar63 * auVar89._4_4_ | (uint)!bVar63 * auVar81._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar63 * auVar89._8_4_ | (uint)!bVar63 * auVar81._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar63 * auVar89._12_4_ | (uint)!bVar63 * auVar81._12_4_);
        bVar63 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar63 * auVar89._16_4_ | (uint)!bVar63 * auVar81._16_4_);
        bVar63 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar63 * auVar89._20_4_ | (uint)!bVar63 * auVar81._20_4_);
        bVar63 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar63 * auVar89._24_4_ | (uint)!bVar63 * auVar81._24_4_);
        bVar63 = SUB81(uVar60 >> 7,0);
        auVar100._28_4_ = (uint)bVar63 * auVar89._28_4_ | (uint)!bVar63 * auVar81._28_4_;
        auVar97 = vandps_avx(auVar186,auVar96);
        auVar99 = vandps_avx(auVar95,auVar186);
        auVar99 = vmaxps_avx(auVar97,auVar99);
        auVar97 = vandps_avx(auVar94,auVar186);
        auVar97 = vmaxps_avx(auVar99,auVar97);
        uVar60 = vcmpps_avx512vl(auVar97,auVar82,1);
        bVar63 = (bool)((byte)uVar60 & 1);
        auVar101._0_4_ = (float)((uint)bVar63 * auVar88._0_4_ | (uint)!bVar63 * auVar96._0_4_);
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar63 * auVar88._4_4_ | (uint)!bVar63 * auVar96._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar63 * auVar88._8_4_ | (uint)!bVar63 * auVar96._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar63 * auVar88._12_4_ | (uint)!bVar63 * auVar96._12_4_);
        bVar63 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar63 * auVar88._16_4_ | (uint)!bVar63 * auVar96._16_4_);
        bVar63 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar63 * auVar88._20_4_ | (uint)!bVar63 * auVar96._20_4_);
        bVar63 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar63 * auVar88._24_4_ | (uint)!bVar63 * auVar96._24_4_);
        bVar63 = SUB81(uVar60 >> 7,0);
        auVar101._28_4_ = (uint)bVar63 * auVar88._28_4_ | (uint)!bVar63 * auVar96._28_4_;
        bVar63 = (bool)((byte)uVar60 & 1);
        auVar102._0_4_ = (float)((uint)bVar63 * auVar89._0_4_ | (uint)!bVar63 * auVar95._0_4_);
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar63 * auVar89._4_4_ | (uint)!bVar63 * auVar95._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar63 * auVar89._8_4_ | (uint)!bVar63 * auVar95._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar63 * auVar89._12_4_ | (uint)!bVar63 * auVar95._12_4_);
        bVar63 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar63 * auVar89._16_4_ | (uint)!bVar63 * auVar95._16_4_);
        bVar63 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar63 * auVar89._20_4_ | (uint)!bVar63 * auVar95._20_4_);
        bVar63 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar63 * auVar89._24_4_ | (uint)!bVar63 * auVar95._24_4_);
        bVar63 = SUB81(uVar60 >> 7,0);
        auVar102._28_4_ = (uint)bVar63 * auVar89._28_4_ | (uint)!bVar63 * auVar95._28_4_;
        auVar80 = vxorps_avx512vl(auVar75,auVar75);
        auVar191 = ZEXT1664(auVar80);
        auVar97 = vfmadd213ps_avx512vl(auVar98,auVar98,ZEXT1632(auVar80));
        auVar75 = vfmadd231ps_fma(auVar97,auVar100,auVar100);
        auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
        fVar155 = auVar97._0_4_;
        fVar162 = auVar97._4_4_;
        fVar163 = auVar97._8_4_;
        fVar164 = auVar97._12_4_;
        fVar143 = auVar97._16_4_;
        fVar154 = auVar97._20_4_;
        fVar68 = auVar97._24_4_;
        auVar96._4_4_ = fVar162 * fVar162 * fVar162 * auVar75._4_4_ * -0.5;
        auVar96._0_4_ = fVar155 * fVar155 * fVar155 * auVar75._0_4_ * -0.5;
        auVar96._8_4_ = fVar163 * fVar163 * fVar163 * auVar75._8_4_ * -0.5;
        auVar96._12_4_ = fVar164 * fVar164 * fVar164 * auVar75._12_4_ * -0.5;
        auVar96._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar96._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar96._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
        auVar96._28_4_ = 0;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar97);
        auVar95._4_4_ = auVar100._4_4_ * auVar96._4_4_;
        auVar95._0_4_ = auVar100._0_4_ * auVar96._0_4_;
        auVar95._8_4_ = auVar100._8_4_ * auVar96._8_4_;
        auVar95._12_4_ = auVar100._12_4_ * auVar96._12_4_;
        auVar95._16_4_ = auVar100._16_4_ * auVar96._16_4_;
        auVar95._20_4_ = auVar100._20_4_ * auVar96._20_4_;
        auVar95._24_4_ = auVar100._24_4_ * auVar96._24_4_;
        auVar95._28_4_ = auVar97._28_4_;
        auVar82._4_4_ = auVar96._4_4_ * -auVar98._4_4_;
        auVar82._0_4_ = auVar96._0_4_ * -auVar98._0_4_;
        auVar82._8_4_ = auVar96._8_4_ * -auVar98._8_4_;
        auVar82._12_4_ = auVar96._12_4_ * -auVar98._12_4_;
        auVar82._16_4_ = auVar96._16_4_ * -auVar98._16_4_;
        auVar82._20_4_ = auVar96._20_4_ * -auVar98._20_4_;
        auVar82._24_4_ = auVar96._24_4_ * -auVar98._24_4_;
        auVar82._28_4_ = auVar98._28_4_ ^ 0x80000000;
        auVar97 = vmulps_avx512vl(auVar96,ZEXT1632(auVar80));
        auVar89 = ZEXT1632(auVar80);
        auVar81 = vfmadd213ps_avx512vl(auVar101,auVar101,auVar89);
        auVar75 = vfmadd231ps_fma(auVar81,auVar102,auVar102);
        auVar81 = vrsqrt14ps_avx512vl(ZEXT1632(auVar75));
        fVar155 = auVar81._0_4_;
        fVar162 = auVar81._4_4_;
        fVar163 = auVar81._8_4_;
        fVar164 = auVar81._12_4_;
        fVar143 = auVar81._16_4_;
        fVar154 = auVar81._20_4_;
        fVar68 = auVar81._24_4_;
        auVar83._4_4_ = fVar162 * fVar162 * fVar162 * auVar75._4_4_ * -0.5;
        auVar83._0_4_ = fVar155 * fVar155 * fVar155 * auVar75._0_4_ * -0.5;
        auVar83._8_4_ = fVar163 * fVar163 * fVar163 * auVar75._8_4_ * -0.5;
        auVar83._12_4_ = fVar164 * fVar164 * fVar164 * auVar75._12_4_ * -0.5;
        auVar83._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar83._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar83._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
        auVar83._28_4_ = 0;
        auVar99 = vfmadd231ps_avx512vl(auVar83,auVar99,auVar81);
        auVar94._4_4_ = auVar102._4_4_ * auVar99._4_4_;
        auVar94._0_4_ = auVar102._0_4_ * auVar99._0_4_;
        auVar94._8_4_ = auVar102._8_4_ * auVar99._8_4_;
        auVar94._12_4_ = auVar102._12_4_ * auVar99._12_4_;
        auVar94._16_4_ = auVar102._16_4_ * auVar99._16_4_;
        auVar94._20_4_ = auVar102._20_4_ * auVar99._20_4_;
        auVar94._24_4_ = auVar102._24_4_ * auVar99._24_4_;
        auVar94._28_4_ = auVar81._28_4_;
        auVar88._4_4_ = -auVar101._4_4_ * auVar99._4_4_;
        auVar88._0_4_ = -auVar101._0_4_ * auVar99._0_4_;
        auVar88._8_4_ = -auVar101._8_4_ * auVar99._8_4_;
        auVar88._12_4_ = -auVar101._12_4_ * auVar99._12_4_;
        auVar88._16_4_ = -auVar101._16_4_ * auVar99._16_4_;
        auVar88._20_4_ = -auVar101._20_4_ * auVar99._20_4_;
        auVar88._24_4_ = -auVar101._24_4_ * auVar99._24_4_;
        auVar88._28_4_ = auVar96._28_4_;
        auVar99 = vmulps_avx512vl(auVar99,auVar89);
        auVar75 = vfmadd213ps_fma(auVar95,auVar91,auVar84);
        auVar70 = vfmadd213ps_fma(auVar82,auVar91,auVar85);
        auVar96 = vfmadd213ps_avx512vl(auVar97,auVar91,auVar93);
        auVar81 = vfmadd213ps_avx512vl(auVar94,ZEXT1632(auVar71),auVar86);
        auVar72 = vfnmadd213ps_fma(auVar95,auVar91,auVar84);
        auVar83 = ZEXT1632(auVar71);
        auVar76 = vfmadd213ps_fma(auVar88,auVar83,auVar87);
        auVar21 = vfnmadd213ps_fma(auVar82,auVar91,auVar85);
        auVar19 = vfmadd213ps_fma(auVar99,auVar83,auVar90);
        auVar95 = vfnmadd231ps_avx512vl(auVar93,auVar91,auVar97);
        auVar79 = vfnmadd213ps_fma(auVar94,auVar83,auVar86);
        auVar74 = vfnmadd213ps_fma(auVar88,auVar83,auVar87);
        auVar73 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar71),auVar99);
        auVar99 = vsubps_avx512vl(auVar81,ZEXT1632(auVar72));
        auVar97 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar21));
        auVar82 = vsubps_avx512vl(ZEXT1632(auVar19),auVar95);
        auVar83 = vmulps_avx512vl(auVar97,auVar95);
        auVar78 = vfmsub231ps_fma(auVar83,ZEXT1632(auVar21),auVar82);
        auVar84._4_4_ = auVar72._4_4_ * auVar82._4_4_;
        auVar84._0_4_ = auVar72._0_4_ * auVar82._0_4_;
        auVar84._8_4_ = auVar72._8_4_ * auVar82._8_4_;
        auVar84._12_4_ = auVar72._12_4_ * auVar82._12_4_;
        auVar84._16_4_ = auVar82._16_4_ * 0.0;
        auVar84._20_4_ = auVar82._20_4_ * 0.0;
        auVar84._24_4_ = auVar82._24_4_ * 0.0;
        auVar84._28_4_ = auVar82._28_4_;
        auVar82 = vfmsub231ps_avx512vl(auVar84,auVar95,auVar99);
        auVar85._4_4_ = auVar21._4_4_ * auVar99._4_4_;
        auVar85._0_4_ = auVar21._0_4_ * auVar99._0_4_;
        auVar85._8_4_ = auVar21._8_4_ * auVar99._8_4_;
        auVar85._12_4_ = auVar21._12_4_ * auVar99._12_4_;
        auVar85._16_4_ = auVar99._16_4_ * 0.0;
        auVar85._20_4_ = auVar99._20_4_ * 0.0;
        auVar85._24_4_ = auVar99._24_4_ * 0.0;
        auVar85._28_4_ = auVar99._28_4_;
        auVar20 = vfmsub231ps_fma(auVar85,ZEXT1632(auVar72),auVar97);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar89,auVar82);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,ZEXT1632(auVar78));
        auVar88 = ZEXT1632(auVar80);
        uVar60 = vcmpps_avx512vl(auVar97,auVar88,2);
        bVar62 = (byte)uVar60;
        fVar68 = (float)((uint)(bVar62 & 1) * auVar75._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar79._0_4_);
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        fVar118 = (float)((uint)bVar63 * auVar75._4_4_ | (uint)!bVar63 * auVar79._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        fVar120 = (float)((uint)bVar63 * auVar75._8_4_ | (uint)!bVar63 * auVar79._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        fVar123 = (float)((uint)bVar63 * auVar75._12_4_ | (uint)!bVar63 * auVar79._12_4_);
        auVar83 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar120,CONCAT44(fVar118,fVar68))));
        fVar69 = (float)((uint)(bVar62 & 1) * auVar70._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar74._0_4_);
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        fVar119 = (float)((uint)bVar63 * auVar70._4_4_ | (uint)!bVar63 * auVar74._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        fVar121 = (float)((uint)bVar63 * auVar70._8_4_ | (uint)!bVar63 * auVar74._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        fVar124 = (float)((uint)bVar63 * auVar70._12_4_ | (uint)!bVar63 * auVar74._12_4_);
        auVar94 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar121,CONCAT44(fVar119,fVar69))));
        auVar93._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar73._0_4_)
        ;
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar93._4_4_ = (float)((uint)bVar63 * auVar96._4_4_ | (uint)!bVar63 * auVar73._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar93._8_4_ = (float)((uint)bVar63 * auVar96._8_4_ | (uint)!bVar63 * auVar73._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar93._12_4_ = (float)((uint)bVar63 * auVar96._12_4_ | (uint)!bVar63 * auVar73._12_4_);
        fVar162 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar96._16_4_);
        auVar93._16_4_ = fVar162;
        fVar155 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar96._20_4_);
        auVar93._20_4_ = fVar155;
        fVar163 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar96._24_4_);
        auVar93._24_4_ = fVar163;
        iVar1 = (uint)(byte)(uVar60 >> 7) * auVar96._28_4_;
        auVar93._28_4_ = iVar1;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar72),auVar81);
        auVar103._0_4_ =
             (uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar78._0_4_;
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar103._4_4_ = (uint)bVar63 * auVar99._4_4_ | (uint)!bVar63 * auVar78._4_4_;
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar103._8_4_ = (uint)bVar63 * auVar99._8_4_ | (uint)!bVar63 * auVar78._8_4_;
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar103._12_4_ = (uint)bVar63 * auVar99._12_4_ | (uint)!bVar63 * auVar78._12_4_;
        auVar103._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar99._16_4_;
        auVar103._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar99._20_4_;
        auVar103._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar99._24_4_;
        auVar103._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar76));
        auVar104._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar70._0_4_)
        ;
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar63 * auVar99._4_4_ | (uint)!bVar63 * auVar70._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar63 * auVar99._8_4_ | (uint)!bVar63 * auVar70._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar63 * auVar99._12_4_ | (uint)!bVar63 * auVar70._12_4_);
        fVar164 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar99._16_4_);
        auVar104._16_4_ = fVar164;
        fVar143 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar99._20_4_);
        auVar104._20_4_ = fVar143;
        fVar154 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar99._24_4_);
        auVar104._24_4_ = fVar154;
        auVar104._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar19));
        auVar105._0_4_ =
             (float)((uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar96._0_4_)
        ;
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar63 * auVar99._4_4_ | (uint)!bVar63 * auVar96._4_4_);
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar63 * auVar99._8_4_ | (uint)!bVar63 * auVar96._8_4_);
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar63 * auVar99._12_4_ | (uint)!bVar63 * auVar96._12_4_);
        bVar63 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar63 * auVar99._16_4_ | (uint)!bVar63 * auVar96._16_4_);
        bVar63 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar63 * auVar99._20_4_ | (uint)!bVar63 * auVar96._20_4_);
        bVar63 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar63 * auVar99._24_4_ | (uint)!bVar63 * auVar96._24_4_);
        bVar63 = SUB81(uVar60 >> 7,0);
        auVar105._28_4_ = (uint)bVar63 * auVar99._28_4_ | (uint)!bVar63 * auVar96._28_4_;
        auVar106._0_4_ =
             (uint)(bVar62 & 1) * (int)auVar72._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar81._0_4_;
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar63 * (int)auVar72._4_4_ | (uint)!bVar63 * auVar81._4_4_;
        bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar63 * (int)auVar72._8_4_ | (uint)!bVar63 * auVar81._8_4_;
        bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar63 * (int)auVar72._12_4_ | (uint)!bVar63 * auVar81._12_4_;
        auVar106._16_4_ = (uint)!(bool)((byte)(uVar60 >> 4) & 1) * auVar81._16_4_;
        auVar106._20_4_ = (uint)!(bool)((byte)(uVar60 >> 5) & 1) * auVar81._20_4_;
        auVar106._24_4_ = (uint)!(bool)((byte)(uVar60 >> 6) & 1) * auVar81._24_4_;
        auVar106._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar81._28_4_;
        bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar107._0_4_ =
             (uint)(bVar62 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar107._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar95._16_4_;
        auVar107._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar95._20_4_;
        auVar107._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar95._24_4_;
        iVar2 = (uint)(byte)(uVar60 >> 7) * auVar95._28_4_;
        auVar107._28_4_ = iVar2;
        auVar84 = vsubps_avx512vl(auVar106,auVar83);
        auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar21._12_4_ |
                                                (uint)!bVar14 * auVar76._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar21._8_4_ |
                                                         (uint)!bVar13 * auVar76._8_4_,
                                                         CONCAT44((uint)bVar63 * (int)auVar21._4_4_
                                                                  | (uint)!bVar63 * auVar76._4_4_,
                                                                  (uint)(bVar62 & 1) *
                                                                  (int)auVar21._0_4_ |
                                                                  (uint)!(bool)(bVar62 & 1) *
                                                                  auVar76._0_4_)))),auVar94);
        auVar96 = vsubps_avx(auVar107,auVar93);
        auVar95 = vsubps_avx(auVar83,auVar103);
        auVar81 = vsubps_avx(auVar94,auVar104);
        auVar82 = vsubps_avx(auVar93,auVar105);
        auVar86._4_4_ = auVar96._4_4_ * fVar118;
        auVar86._0_4_ = auVar96._0_4_ * fVar68;
        auVar86._8_4_ = auVar96._8_4_ * fVar120;
        auVar86._12_4_ = auVar96._12_4_ * fVar123;
        auVar86._16_4_ = auVar96._16_4_ * 0.0;
        auVar86._20_4_ = auVar96._20_4_ * 0.0;
        auVar86._24_4_ = auVar96._24_4_ * 0.0;
        auVar86._28_4_ = iVar2;
        auVar75 = vfmsub231ps_fma(auVar86,auVar93,auVar84);
        auVar87._4_4_ = fVar119 * auVar84._4_4_;
        auVar87._0_4_ = fVar69 * auVar84._0_4_;
        auVar87._8_4_ = fVar121 * auVar84._8_4_;
        auVar87._12_4_ = fVar124 * auVar84._12_4_;
        auVar87._16_4_ = auVar84._16_4_ * 0.0;
        auVar87._20_4_ = auVar84._20_4_ * 0.0;
        auVar87._24_4_ = auVar84._24_4_ * 0.0;
        auVar87._28_4_ = auVar97._28_4_;
        auVar70 = vfmsub231ps_fma(auVar87,auVar83,auVar99);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),auVar88,ZEXT1632(auVar75));
        auVar158._0_4_ = auVar99._0_4_ * auVar93._0_4_;
        auVar158._4_4_ = auVar99._4_4_ * auVar93._4_4_;
        auVar158._8_4_ = auVar99._8_4_ * auVar93._8_4_;
        auVar158._12_4_ = auVar99._12_4_ * auVar93._12_4_;
        auVar158._16_4_ = auVar99._16_4_ * fVar162;
        auVar158._20_4_ = auVar99._20_4_ * fVar155;
        auVar158._24_4_ = auVar99._24_4_ * fVar163;
        auVar158._28_4_ = 0;
        auVar75 = vfmsub231ps_fma(auVar158,auVar94,auVar96);
        auVar85 = vfmadd231ps_avx512vl(auVar97,auVar88,ZEXT1632(auVar75));
        auVar97 = vmulps_avx512vl(auVar82,auVar103);
        auVar97 = vfmsub231ps_avx512vl(auVar97,auVar95,auVar105);
        auVar89._4_4_ = auVar81._4_4_ * auVar105._4_4_;
        auVar89._0_4_ = auVar81._0_4_ * auVar105._0_4_;
        auVar89._8_4_ = auVar81._8_4_ * auVar105._8_4_;
        auVar89._12_4_ = auVar81._12_4_ * auVar105._12_4_;
        auVar89._16_4_ = auVar81._16_4_ * auVar105._16_4_;
        auVar89._20_4_ = auVar81._20_4_ * auVar105._20_4_;
        auVar89._24_4_ = auVar81._24_4_ * auVar105._24_4_;
        auVar89._28_4_ = auVar105._28_4_;
        auVar75 = vfmsub231ps_fma(auVar89,auVar104,auVar82);
        auVar159._0_4_ = auVar104._0_4_ * auVar95._0_4_;
        auVar159._4_4_ = auVar104._4_4_ * auVar95._4_4_;
        auVar159._8_4_ = auVar104._8_4_ * auVar95._8_4_;
        auVar159._12_4_ = auVar104._12_4_ * auVar95._12_4_;
        auVar159._16_4_ = fVar164 * auVar95._16_4_;
        auVar159._20_4_ = fVar143 * auVar95._20_4_;
        auVar159._24_4_ = fVar154 * auVar95._24_4_;
        auVar159._28_4_ = 0;
        auVar70 = vfmsub231ps_fma(auVar159,auVar81,auVar103);
        auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),auVar88,auVar97);
        auVar86 = vfmadd231ps_avx512vl(auVar97,auVar88,ZEXT1632(auVar75));
        auVar97 = vmaxps_avx(auVar85,auVar86);
        uVar136 = vcmpps_avx512vl(auVar97,auVar88,2);
        local_6f0 = local_6f0 & (byte)uVar136;
        in_ZMM20 = ZEXT3264(local_820);
        auVar190 = ZEXT3264(local_7e0);
        auVar135 = ZEXT3264(local_8c0);
        auVar185 = ZEXT1664(local_920);
        if (local_6f0 == 0) {
          local_6f0 = 0;
          auVar172 = ZEXT3264(auVar141);
          auVar142 = ZEXT3264(auVar108);
        }
        else {
          auVar32._4_4_ = auVar82._4_4_ * auVar99._4_4_;
          auVar32._0_4_ = auVar82._0_4_ * auVar99._0_4_;
          auVar32._8_4_ = auVar82._8_4_ * auVar99._8_4_;
          auVar32._12_4_ = auVar82._12_4_ * auVar99._12_4_;
          auVar32._16_4_ = auVar82._16_4_ * auVar99._16_4_;
          auVar32._20_4_ = auVar82._20_4_ * auVar99._20_4_;
          auVar32._24_4_ = auVar82._24_4_ * auVar99._24_4_;
          auVar32._28_4_ = auVar97._28_4_;
          auVar76 = vfmsub231ps_fma(auVar32,auVar81,auVar96);
          auVar33._4_4_ = auVar96._4_4_ * auVar95._4_4_;
          auVar33._0_4_ = auVar96._0_4_ * auVar95._0_4_;
          auVar33._8_4_ = auVar96._8_4_ * auVar95._8_4_;
          auVar33._12_4_ = auVar96._12_4_ * auVar95._12_4_;
          auVar33._16_4_ = auVar96._16_4_ * auVar95._16_4_;
          auVar33._20_4_ = auVar96._20_4_ * auVar95._20_4_;
          auVar33._24_4_ = auVar96._24_4_ * auVar95._24_4_;
          auVar33._28_4_ = auVar96._28_4_;
          auVar70 = vfmsub231ps_fma(auVar33,auVar84,auVar82);
          auVar34._4_4_ = auVar81._4_4_ * auVar84._4_4_;
          auVar34._0_4_ = auVar81._0_4_ * auVar84._0_4_;
          auVar34._8_4_ = auVar81._8_4_ * auVar84._8_4_;
          auVar34._12_4_ = auVar81._12_4_ * auVar84._12_4_;
          auVar34._16_4_ = auVar81._16_4_ * auVar84._16_4_;
          auVar34._20_4_ = auVar81._20_4_ * auVar84._20_4_;
          auVar34._24_4_ = auVar81._24_4_ * auVar84._24_4_;
          auVar34._28_4_ = auVar81._28_4_;
          auVar19 = vfmsub231ps_fma(auVar34,auVar95,auVar99);
          auVar75 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar70),ZEXT1632(auVar19));
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar76),auVar88);
          auVar99 = vrcp14ps_avx512vl(auVar97);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = &DAT_3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar96 = vfnmadd213ps_avx512vl(auVar99,auVar97,auVar25);
          auVar75 = vfmadd132ps_fma(auVar96,auVar99,auVar99);
          auVar35._4_4_ = auVar19._4_4_ * auVar93._4_4_;
          auVar35._0_4_ = auVar19._0_4_ * auVar93._0_4_;
          auVar35._8_4_ = auVar19._8_4_ * auVar93._8_4_;
          auVar35._12_4_ = auVar19._12_4_ * auVar93._12_4_;
          auVar35._16_4_ = fVar162 * 0.0;
          auVar35._20_4_ = fVar155 * 0.0;
          auVar35._24_4_ = fVar163 * 0.0;
          auVar35._28_4_ = iVar1;
          auVar70 = vfmadd231ps_fma(auVar35,auVar94,ZEXT1632(auVar70));
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar83,ZEXT1632(auVar76));
          fVar155 = auVar75._0_4_;
          fVar162 = auVar75._4_4_;
          fVar163 = auVar75._8_4_;
          fVar164 = auVar75._12_4_;
          auVar99 = ZEXT1632(CONCAT412(auVar70._12_4_ * fVar164,
                                       CONCAT48(auVar70._8_4_ * fVar163,
                                                CONCAT44(auVar70._4_4_ * fVar162,
                                                         auVar70._0_4_ * fVar155))));
          auVar142 = ZEXT3264(auVar99);
          auVar176._4_4_ = uVar180;
          auVar176._0_4_ = uVar180;
          auVar176._8_4_ = uVar180;
          auVar176._12_4_ = uVar180;
          auVar176._16_4_ = uVar180;
          auVar176._20_4_ = uVar180;
          auVar176._24_4_ = uVar180;
          auVar176._28_4_ = uVar180;
          uVar136 = vcmpps_avx512vl(auVar176,auVar99,2);
          uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar26._4_4_ = uVar127;
          auVar26._0_4_ = uVar127;
          auVar26._8_4_ = uVar127;
          auVar26._12_4_ = uVar127;
          auVar26._16_4_ = uVar127;
          auVar26._20_4_ = uVar127;
          auVar26._24_4_ = uVar127;
          auVar26._28_4_ = uVar127;
          uVar22 = vcmpps_avx512vl(auVar99,auVar26,2);
          local_6f0 = (byte)uVar136 & (byte)uVar22 & local_6f0;
          if (local_6f0 == 0) {
            local_6f0 = 0;
            auVar172 = ZEXT3264(auVar141);
            auVar142 = ZEXT3264(auVar108);
          }
          else {
            uVar136 = vcmpps_avx512vl(auVar97,auVar88,4);
            if ((local_6f0 & (byte)uVar136) == 0) {
              local_6f0 = 0;
              auVar172 = ZEXT3264(auVar141);
              auVar142 = ZEXT3264(auVar108);
            }
            else {
              local_6f0 = local_6f0 & (byte)uVar136;
              fVar143 = auVar85._0_4_ * fVar155;
              fVar154 = auVar85._4_4_ * fVar162;
              auVar108._4_4_ = fVar154;
              auVar108._0_4_ = fVar143;
              fVar68 = auVar85._8_4_ * fVar163;
              auVar108._8_4_ = fVar68;
              fVar69 = auVar85._12_4_ * fVar164;
              auVar108._12_4_ = fVar69;
              fVar118 = auVar85._16_4_ * 0.0;
              auVar108._16_4_ = fVar118;
              fVar119 = auVar85._20_4_ * 0.0;
              auVar108._20_4_ = fVar119;
              fVar120 = auVar85._24_4_ * 0.0;
              auVar108._24_4_ = fVar120;
              auVar108._28_4_ = auVar85._28_4_;
              fVar155 = auVar86._0_4_ * fVar155;
              fVar162 = auVar86._4_4_ * fVar162;
              auVar141._4_4_ = fVar162;
              auVar141._0_4_ = fVar155;
              fVar163 = auVar86._8_4_ * fVar163;
              auVar141._8_4_ = fVar163;
              fVar164 = auVar86._12_4_ * fVar164;
              auVar141._12_4_ = fVar164;
              fVar121 = auVar86._16_4_ * 0.0;
              auVar141._16_4_ = fVar121;
              fVar123 = auVar86._20_4_ * 0.0;
              auVar141._20_4_ = fVar123;
              fVar124 = auVar86._24_4_ * 0.0;
              auVar141._24_4_ = fVar124;
              auVar141._28_4_ = auVar86._28_4_;
              auVar168._8_4_ = 0x3f800000;
              auVar168._0_8_ = &DAT_3f8000003f800000;
              auVar168._12_4_ = 0x3f800000;
              auVar168._16_4_ = 0x3f800000;
              auVar168._20_4_ = 0x3f800000;
              auVar168._24_4_ = 0x3f800000;
              auVar168._28_4_ = 0x3f800000;
              auVar108 = vsubps_avx(auVar168,auVar108);
              bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar60 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar60 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar60 >> 6) & 1);
              bVar17 = SUB81(uVar60 >> 7,0);
              auVar172 = ZEXT3264(CONCAT428((uint)bVar17 * auVar85._28_4_ |
                                            (uint)!bVar17 * auVar108._28_4_,
                                            CONCAT424((uint)bVar16 * (int)fVar120 |
                                                      (uint)!bVar16 * auVar108._24_4_,
                                                      CONCAT420((uint)bVar15 * (int)fVar119 |
                                                                (uint)!bVar15 * auVar108._20_4_,
                                                                CONCAT416((uint)bVar14 *
                                                                          (int)fVar118 |
                                                                          (uint)!bVar14 *
                                                                          auVar108._16_4_,
                                                                          CONCAT412((uint)bVar13 *
                                                                                    (int)fVar69 |
                                                                                    (uint)!bVar13 *
                                                                                    auVar108._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar12 * (int)fVar68 |
                                                  (uint)!bVar12 * auVar108._8_4_,
                                                  CONCAT44((uint)bVar63 * (int)fVar154 |
                                                           (uint)!bVar63 * auVar108._4_4_,
                                                           (uint)(bVar62 & 1) * (int)fVar143 |
                                                           (uint)!(bool)(bVar62 & 1) *
                                                           auVar108._0_4_))))))));
              auVar108 = vsubps_avx(auVar168,auVar141);
              bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar60 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar60 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar60 >> 6) & 1);
              bVar17 = SUB81(uVar60 >> 7,0);
              local_600._4_4_ = (uint)bVar63 * (int)fVar162 | (uint)!bVar63 * auVar108._4_4_;
              local_600._0_4_ =
                   (uint)(bVar62 & 1) * (int)fVar155 | (uint)!(bool)(bVar62 & 1) * auVar108._0_4_;
              local_600._8_4_ = (uint)bVar12 * (int)fVar163 | (uint)!bVar12 * auVar108._8_4_;
              local_600._12_4_ = (uint)bVar13 * (int)fVar164 | (uint)!bVar13 * auVar108._12_4_;
              local_600._16_4_ = (uint)bVar14 * (int)fVar121 | (uint)!bVar14 * auVar108._16_4_;
              local_600._20_4_ = (uint)bVar15 * (int)fVar123 | (uint)!bVar15 * auVar108._20_4_;
              local_600._24_4_ = (uint)bVar16 * (int)fVar124 | (uint)!bVar16 * auVar108._24_4_;
              local_600._28_4_ = (uint)bVar17 * auVar86._28_4_ | (uint)!bVar17 * auVar108._28_4_;
            }
          }
        }
        auVar189 = ZEXT3264(local_840);
        if (local_6f0 != 0) {
          auVar108 = vsubps_avx(ZEXT1632(auVar71),auVar91);
          auVar97 = auVar172._0_32_;
          auVar75 = vfmadd213ps_fma(auVar108,auVar97,auVar91);
          uVar127 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar91._4_4_ = uVar127;
          auVar91._0_4_ = uVar127;
          auVar91._8_4_ = uVar127;
          auVar91._12_4_ = uVar127;
          auVar91._16_4_ = uVar127;
          auVar91._20_4_ = uVar127;
          auVar91._24_4_ = uVar127;
          auVar91._28_4_ = uVar127;
          auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar75._12_4_ + auVar75._12_4_,
                                                        CONCAT48(auVar75._8_4_ + auVar75._8_4_,
                                                                 CONCAT44(auVar75._4_4_ +
                                                                          auVar75._4_4_,
                                                                          auVar75._0_4_ +
                                                                          auVar75._0_4_)))),auVar91)
          ;
          auVar141 = auVar142._0_32_;
          uVar136 = vcmpps_avx512vl(auVar141,auVar108,6);
          local_6f0 = local_6f0 & (byte)uVar136;
          if (local_6f0 != 0) {
            auVar132._8_4_ = 0xbf800000;
            auVar132._0_8_ = 0xbf800000bf800000;
            auVar132._12_4_ = 0xbf800000;
            auVar132._16_4_ = 0xbf800000;
            auVar132._20_4_ = 0xbf800000;
            auVar132._24_4_ = 0xbf800000;
            auVar132._28_4_ = 0xbf800000;
            auVar27._8_4_ = 0x40000000;
            auVar27._0_8_ = 0x4000000040000000;
            auVar27._12_4_ = 0x40000000;
            auVar27._16_4_ = 0x40000000;
            auVar27._20_4_ = 0x40000000;
            auVar27._24_4_ = 0x40000000;
            auVar27._28_4_ = 0x40000000;
            local_780 = vfmadd132ps_avx512vl(local_600,auVar132,auVar27);
            local_600 = local_780;
            auVar108 = local_600;
            local_740 = 0;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar63 = true, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar155 = 1.0 / auVar92._0_4_;
                local_6e0[0] = fVar155 * (auVar172._0_4_ + 0.0);
                local_6e0[1] = fVar155 * (auVar172._4_4_ + 1.0);
                local_6e0[2] = fVar155 * (auVar172._8_4_ + 2.0);
                local_6e0[3] = fVar155 * (auVar172._12_4_ + 3.0);
                fStack_6d0 = fVar155 * (auVar172._16_4_ + 4.0);
                fStack_6cc = fVar155 * (auVar172._20_4_ + 5.0);
                fStack_6c8 = fVar155 * (auVar172._24_4_ + 6.0);
                fStack_6c4 = auVar172._28_4_ + 7.0;
                local_600._0_8_ = local_780._0_8_;
                local_600._8_8_ = local_780._8_8_;
                local_600._16_8_ = local_780._16_8_;
                local_600._24_8_ = local_780._24_8_;
                local_6c0 = local_600._0_8_;
                uStack_6b8 = local_600._8_8_;
                uStack_6b0 = local_600._16_8_;
                uStack_6a8 = local_600._24_8_;
                local_6a0 = auVar141;
                lVar66 = 0;
                uVar64 = (ulong)local_6f0;
                for (uVar60 = uVar64; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000)
                {
                  lVar66 = lVar66 + 1;
                }
                auVar142 = vpbroadcastd_avx512f();
                _local_4c0 = vmovdqa64_avx512f(auVar142);
                auVar142 = vpbroadcastd_avx512f();
                local_580 = vmovdqa64_avx512f(auVar142);
                local_900 = (undefined4)local_8e0;
                uStack_8fc = (undefined4)((ulong)local_8e0 >> 0x20);
                bVar63 = true;
                local_910 = local_880;
                uStack_908 = uStack_878;
                uStack_8f8 = uStack_8d8;
                uStack_8e8 = uStack_8c8;
                local_7a0 = auVar97;
                local_760 = auVar141;
                local_73c = iVar9;
                local_730 = auVar77;
                local_720 = local_8f0;
                uStack_718 = uStack_8c8;
                local_710 = local_8e0;
                uStack_708 = uStack_8d8;
                local_700 = local_880;
                uStack_6f8 = uStack_878;
                local_600 = auVar108;
                do {
                  auVar71 = auVar191._0_16_;
                  local_7c0 = (float)uVar64;
                  fStack_7bc = (float)(uVar64 >> 0x20);
                  uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_6e0[lVar66]));
                  local_640 = (uint)lVar66;
                  uStack_63c = (uint)((ulong)lVar66 >> 0x20);
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_6c0 + lVar66 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_6a0 + lVar66 * 4);
                  local_950.context = context->user;
                  fVar162 = local_200._0_4_;
                  fVar155 = 1.0 - fVar162;
                  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar162 * (fVar155 + fVar155))),
                                             ZEXT416((uint)fVar155),ZEXT416((uint)fVar155));
                  auVar76 = local_200._0_16_;
                  auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                            ZEXT416(0xc0a00000));
                  auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162 * 3.0)),
                                            ZEXT416((uint)(fVar162 + fVar162)),auVar75);
                  auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                            ZEXT416(0x40000000));
                  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * fVar155 * -3.0)),
                                            ZEXT416((uint)(fVar155 + fVar155)),auVar75);
                  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),auVar76,
                                            ZEXT416((uint)(fVar155 * -2.0)));
                  fVar155 = auVar19._0_4_ * 0.5;
                  fVar162 = auVar70._0_4_ * 0.5;
                  fVar163 = auVar75._0_4_ * 0.5;
                  fVar164 = auVar76._0_4_ * 0.5;
                  auVar149._0_4_ = fVar164 * (float)local_910;
                  auVar149._4_4_ = fVar164 * local_910._4_4_;
                  auVar149._8_4_ = fVar164 * (float)uStack_908;
                  auVar149._12_4_ = fVar164 * uStack_908._4_4_;
                  auVar166._4_4_ = fVar163;
                  auVar166._0_4_ = fVar163;
                  auVar166._8_4_ = fVar163;
                  auVar166._12_4_ = fVar163;
                  auVar55._4_4_ = uStack_8fc;
                  auVar55._0_4_ = local_900;
                  auVar55._8_8_ = uStack_8f8;
                  auVar75 = vfmadd132ps_fma(auVar166,auVar149,auVar55);
                  auVar150._4_4_ = fVar162;
                  auVar150._0_4_ = fVar162;
                  auVar150._8_4_ = fVar162;
                  auVar150._12_4_ = fVar162;
                  auVar56._8_8_ = uStack_8e8;
                  auVar56._0_8_ = local_8f0;
                  auVar75 = vfmadd132ps_fma(auVar150,auVar75,auVar56);
                  auVar130._4_4_ = fVar155;
                  auVar130._0_4_ = fVar155;
                  auVar130._8_4_ = fVar155;
                  auVar130._12_4_ = fVar155;
                  auVar75 = vfmadd213ps_fma(auVar130,auVar77,auVar75);
                  auVar142 = vbroadcastss_avx512f(auVar75);
                  auVar172 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar172,ZEXT1664(auVar75));
                  auVar172 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar172,ZEXT1664(auVar75));
                  local_2c0[0] = (RTCHitN)auVar142[0];
                  local_2c0[1] = (RTCHitN)auVar142[1];
                  local_2c0[2] = (RTCHitN)auVar142[2];
                  local_2c0[3] = (RTCHitN)auVar142[3];
                  local_2c0[4] = (RTCHitN)auVar142[4];
                  local_2c0[5] = (RTCHitN)auVar142[5];
                  local_2c0[6] = (RTCHitN)auVar142[6];
                  local_2c0[7] = (RTCHitN)auVar142[7];
                  local_2c0[8] = (RTCHitN)auVar142[8];
                  local_2c0[9] = (RTCHitN)auVar142[9];
                  local_2c0[10] = (RTCHitN)auVar142[10];
                  local_2c0[0xb] = (RTCHitN)auVar142[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar142[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar142[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar142[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar142[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar142[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar142[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar142[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar142[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar142[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar142[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar142[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar142[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar142[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar142[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar142[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar142[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar142[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar142[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar142[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar142[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar142[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar142[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar142[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar142[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar142[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar142[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar142[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar142[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar142[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar142[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar142[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar142[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar142[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar142[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar142[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar142[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar142[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar142[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar142[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar142[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar142[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar142[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar142[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar142[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar142[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar142[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar142[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar142[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar142[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar142[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar142[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar142[0x3f];
                  local_180 = local_580._0_8_;
                  uStack_178 = local_580._8_8_;
                  uStack_170 = local_580._16_8_;
                  uStack_168 = local_580._24_8_;
                  uStack_160 = local_580._32_8_;
                  uStack_158 = local_580._40_8_;
                  uStack_150 = local_580._48_8_;
                  uStack_148 = local_580._56_8_;
                  auVar142 = vmovdqa64_avx512f(_local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar142);
                  vpcmpeqd_avx2(auVar142._0_32_,auVar142._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_950.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_950.context)->instPrimID[0]));
                  local_680 = local_300;
                  local_950.valid = (int *)local_680;
                  local_950.geometryUserPtr = pGVar10->userPtr;
                  local_950.hit = local_2c0;
                  local_950.N = 0x10;
                  local_540._0_4_ = uVar127;
                  local_950.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_950);
                    auVar185 = ZEXT1664(local_920);
                    auVar135 = ZEXT3264(local_8c0);
                    auVar188 = ZEXT3264(local_8a0);
                    auVar190 = ZEXT3264(local_7e0);
                    in_ZMM20 = ZEXT3264(local_820);
                    auVar75 = vxorps_avx512vl(auVar71,auVar71);
                    auVar191 = ZEXT1664(auVar75);
                    auVar189 = ZEXT3264(local_840);
                    uVar127 = local_540._0_4_;
                    uVar180 = local_860._0_4_;
                  }
                  auVar75 = auVar191._0_16_;
                  auVar142 = vmovdqa64_avx512f(local_680);
                  uVar136 = vptestmd_avx512f(auVar142,auVar142);
                  if ((short)uVar136 == 0) {
                    uVar64 = CONCAT44(fStack_7bc,local_7c0);
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_950);
                      auVar185 = ZEXT1664(local_920);
                      auVar135 = ZEXT3264(local_8c0);
                      auVar188 = ZEXT3264(local_8a0);
                      auVar190 = ZEXT3264(local_7e0);
                      in_ZMM20 = ZEXT3264(local_820);
                      auVar75 = vxorps_avx512vl(auVar75,auVar75);
                      auVar191 = ZEXT1664(auVar75);
                      auVar189 = ZEXT3264(local_840);
                      uVar180 = local_860._0_4_;
                      uVar127 = local_540._0_4_;
                    }
                    auVar142 = vmovdqa64_avx512f(local_680);
                    uVar60 = vptestmd_avx512f(auVar142,auVar142);
                    auVar172 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar60 & 1);
                    auVar142._0_4_ =
                         (uint)bVar12 * auVar172._0_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x200);
                    bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
                    auVar142._4_4_ =
                         (uint)bVar12 * auVar172._4_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x204);
                    bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
                    auVar142._8_4_ =
                         (uint)bVar12 * auVar172._8_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x208);
                    bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
                    auVar142._12_4_ =
                         (uint)bVar12 * auVar172._12_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x20c);
                    bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
                    auVar142._16_4_ =
                         (uint)bVar12 * auVar172._16_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x210);
                    bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
                    auVar142._20_4_ =
                         (uint)bVar12 * auVar172._20_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x214);
                    bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
                    auVar142._24_4_ =
                         (uint)bVar12 * auVar172._24_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x218);
                    bVar12 = (bool)((byte)(uVar60 >> 7) & 1);
                    auVar142._28_4_ =
                         (uint)bVar12 * auVar172._28_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x21c);
                    bVar12 = (bool)((byte)(uVar60 >> 8) & 1);
                    auVar142._32_4_ =
                         (uint)bVar12 * auVar172._32_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x220);
                    bVar12 = (bool)((byte)(uVar60 >> 9) & 1);
                    auVar142._36_4_ =
                         (uint)bVar12 * auVar172._36_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x224);
                    bVar12 = (bool)((byte)(uVar60 >> 10) & 1);
                    auVar142._40_4_ =
                         (uint)bVar12 * auVar172._40_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x228);
                    bVar12 = (bool)((byte)(uVar60 >> 0xb) & 1);
                    auVar142._44_4_ =
                         (uint)bVar12 * auVar172._44_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x22c);
                    bVar12 = (bool)((byte)(uVar60 >> 0xc) & 1);
                    auVar142._48_4_ =
                         (uint)bVar12 * auVar172._48_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x230);
                    bVar12 = (bool)((byte)(uVar60 >> 0xd) & 1);
                    auVar142._52_4_ =
                         (uint)bVar12 * auVar172._52_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x234);
                    bVar12 = (bool)((byte)(uVar60 >> 0xe) & 1);
                    auVar142._56_4_ =
                         (uint)bVar12 * auVar172._56_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x238);
                    bVar12 = SUB81(uVar60 >> 0xf,0);
                    auVar142._60_4_ =
                         (uint)bVar12 * auVar172._60_4_ |
                         (uint)!bVar12 * *(int *)(local_950.ray + 0x23c);
                    *(undefined1 (*) [64])(local_950.ray + 0x200) = auVar142;
                    uVar64 = CONCAT44(fStack_7bc,local_7c0);
                    local_7c0 = auVar185._0_4_;
                    if ((short)uVar60 != 0) break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar127;
                  lVar66 = 0;
                  uVar64 = uVar64 ^ 1L << ((ulong)local_640 & 0x3f);
                  for (uVar60 = uVar64; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000
                      ) {
                    lVar66 = lVar66 + 1;
                  }
                  bVar63 = uVar64 != 0;
                  local_7c0 = auVar185._0_4_;
                } while (bVar63);
                auVar172 = ZEXT3264(auVar97);
                auVar142 = ZEXT3264(auVar141);
              }
              goto LAB_01b6db5e;
            }
          }
        }
        bVar63 = false;
      }
LAB_01b6db5e:
      auVar185 = _local_4c0;
      local_840 = auVar189._0_32_;
      if (8 < iVar9) {
        local_860 = vpbroadcastd_avx512vl();
        local_640 = uVar180;
        uStack_63c = uVar180;
        uStack_638 = uVar180;
        uStack_634 = uVar180;
        uStack_630 = uVar180;
        uStack_62c = uVar180;
        uStack_628 = uVar180;
        uStack_624 = uVar180;
        local_4c0._4_4_ = 1.0 / (float)local_500._0_4_;
        local_4c0._0_4_ = local_4c0._4_4_;
        fStack_4b8 = (float)local_4c0._4_4_;
        fStack_4b4 = (float)local_4c0._4_4_;
        fStack_4b0 = (float)local_4c0._4_4_;
        fStack_4ac = (float)local_4c0._4_4_;
        fStack_4a8 = (float)local_4c0._4_4_;
        auStack_4a0 = auVar185._32_32_;
        fStack_4a4 = (float)local_4c0._4_4_;
        auVar185 = vpbroadcastd_avx512f();
        local_500 = vmovdqa64_avx512f(auVar185);
        auVar185 = vpbroadcastd_avx512f();
        local_540 = vmovdqa64_avx512f(auVar185);
        lVar66 = 8;
        auVar141 = auVar172._0_32_;
        auVar108 = auVar142._0_32_;
        fStack_7bc = local_7c0;
        fStack_7b8 = local_7c0;
        fStack_7b4 = local_7c0;
        fStack_7b0 = local_7c0;
        fStack_7ac = local_7c0;
        fStack_7a8 = local_7c0;
        fStack_7a4 = local_7c0;
        do {
          auVar97 = vpbroadcastd_avx512vl();
          auVar81 = vpor_avx2(auVar97,_DAT_0205a920);
          uVar22 = vpcmpd_avx512vl(auVar81,local_860,1);
          auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66 * 4 + lVar23);
          auVar99 = *(undefined1 (*) [32])(lVar23 + 0x22307f0 + lVar66 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar23 + 0x2230c74 + lVar66 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar23 + 0x22310f8 + lVar66 * 4);
          auVar82 = vmulps_avx512vl(local_3c0,auVar95);
          auVar83 = vmulps_avx512vl(local_3e0,auVar95);
          auVar36._4_4_ = auVar95._4_4_ * (float)local_400._4_4_;
          auVar36._0_4_ = auVar95._0_4_ * (float)local_400._0_4_;
          auVar36._8_4_ = auVar95._8_4_ * fStack_3f8;
          auVar36._12_4_ = auVar95._12_4_ * fStack_3f4;
          auVar36._16_4_ = auVar95._16_4_ * fStack_3f0;
          auVar36._20_4_ = auVar95._20_4_ * fStack_3ec;
          auVar36._24_4_ = auVar95._24_4_ * fStack_3e8;
          auVar36._28_4_ = auVar81._28_4_;
          auVar81 = vfmadd231ps_avx512vl(auVar82,auVar96,local_360);
          auVar82 = vfmadd231ps_avx512vl(auVar83,auVar96,local_380);
          auVar83 = vfmadd231ps_avx512vl(auVar36,auVar96,local_3a0);
          auVar93 = auVar135._0_32_;
          auVar81 = vfmadd231ps_avx512vl(auVar81,auVar99,auVar93);
          auVar82 = vfmadd231ps_avx512vl(auVar82,auVar99,local_5a0);
          auVar75 = vfmadd231ps_fma(auVar83,auVar99,local_340);
          auVar100 = auVar190._0_32_;
          auVar86 = vfmadd231ps_avx512vl(auVar81,auVar97,auVar100);
          auVar98 = auVar188._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar82,auVar97,auVar98);
          auVar81 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66 * 4 + lVar23);
          auVar82 = *(undefined1 (*) [32])(lVar23 + 0x2232c10 + lVar66 * 4);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar97,local_320);
          auVar83 = *(undefined1 (*) [32])(lVar23 + 0x2233094 + lVar66 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar23 + 0x2233518 + lVar66 * 4);
          auVar84 = vmulps_avx512vl(local_3c0,auVar94);
          auVar85 = vmulps_avx512vl(local_3e0,auVar94);
          auVar37._4_4_ = auVar94._4_4_ * (float)local_400._4_4_;
          auVar37._0_4_ = auVar94._0_4_ * (float)local_400._0_4_;
          auVar37._8_4_ = auVar94._8_4_ * fStack_3f8;
          auVar37._12_4_ = auVar94._12_4_ * fStack_3f4;
          auVar37._16_4_ = auVar94._16_4_ * fStack_3f0;
          auVar37._20_4_ = auVar94._20_4_ * fStack_3ec;
          auVar37._24_4_ = auVar94._24_4_ * fStack_3e8;
          auVar37._28_4_ = uStack_3e4;
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar83,local_360);
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar83,local_380);
          auVar88 = vfmadd231ps_avx512vl(auVar37,auVar83,local_3a0);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar93);
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar82,local_5a0);
          auVar70 = vfmadd231ps_fma(auVar88,auVar82,local_340);
          auVar88 = vfmadd231ps_avx512vl(auVar84,auVar81,auVar100);
          auVar89 = vfmadd231ps_avx512vl(auVar85,auVar81,auVar98);
          auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar81,local_320);
          auVar90 = vmaxps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar70));
          auVar84 = vsubps_avx(auVar88,auVar86);
          auVar85 = vsubps_avx(auVar89,auVar87);
          auVar91 = vmulps_avx512vl(auVar87,auVar84);
          auVar92 = vmulps_avx512vl(auVar86,auVar85);
          auVar91 = vsubps_avx512vl(auVar91,auVar92);
          auVar92 = vmulps_avx512vl(auVar85,auVar85);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar84,auVar84);
          auVar90 = vmulps_avx512vl(auVar90,auVar90);
          auVar90 = vmulps_avx512vl(auVar90,auVar92);
          auVar91 = vmulps_avx512vl(auVar91,auVar91);
          uVar136 = vcmpps_avx512vl(auVar91,auVar90,2);
          local_6f0 = (byte)uVar22 & (byte)uVar136;
          if (local_6f0 == 0) {
            auVar188 = ZEXT3264(auVar98);
            auVar135 = ZEXT3264(auVar93);
          }
          else {
            auVar94 = vmulps_avx512vl(local_800,auVar94);
            auVar83 = vfmadd213ps_avx512vl(auVar83,local_460,auVar94);
            auVar82 = vfmadd213ps_avx512vl(auVar82,local_440,auVar83);
            auVar81 = vfmadd213ps_avx512vl(auVar81,local_420,auVar82);
            auVar95 = vmulps_avx512vl(local_800,auVar95);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_460,auVar95);
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_440,auVar96);
            auVar82 = vfmadd213ps_avx512vl(auVar97,local_420,auVar99);
            auVar97 = *(undefined1 (*) [32])(lVar23 + 0x223157c + lVar66 * 4);
            auVar99 = *(undefined1 (*) [32])(lVar23 + 0x2231a00 + lVar66 * 4);
            auVar96 = *(undefined1 (*) [32])(lVar23 + 0x2231e84 + lVar66 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar23 + 0x2232308 + lVar66 * 4);
            auVar83 = vmulps_avx512vl(local_3c0,auVar95);
            auVar94 = vmulps_avx512vl(local_3e0,auVar95);
            auVar95 = vmulps_avx512vl(local_800,auVar95);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar96,local_360);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,local_380);
            auVar96 = vfmadd231ps_avx512vl(auVar95,local_460,auVar96);
            auVar95 = vfmadd231ps_avx512vl(auVar83,auVar99,auVar93);
            auVar83 = vfmadd231ps_avx512vl(auVar94,auVar99,local_5a0);
            auVar99 = vfmadd231ps_avx512vl(auVar96,local_440,auVar99);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar100);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar97,auVar98);
            auVar94 = vfmadd231ps_avx512vl(auVar99,local_420,auVar97);
            auVar97 = *(undefined1 (*) [32])(lVar23 + 0x223399c + lVar66 * 4);
            auVar99 = *(undefined1 (*) [32])(lVar23 + 0x22342a4 + lVar66 * 4);
            auVar96 = *(undefined1 (*) [32])(lVar23 + 0x2234728 + lVar66 * 4);
            auVar90 = vmulps_avx512vl(local_3c0,auVar96);
            auVar91 = vmulps_avx512vl(local_3e0,auVar96);
            auVar96 = vmulps_avx512vl(local_800,auVar96);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,local_360);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,local_380);
            auVar96 = vfmadd231ps_avx512vl(auVar96,local_460,auVar99);
            auVar99 = *(undefined1 (*) [32])(lVar23 + 0x2233e20 + lVar66 * 4);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,auVar93);
            auVar76 = vfmadd231ps_fma(auVar91,auVar99,local_5a0);
            auVar99 = vfmadd231ps_avx512vl(auVar96,local_440,auVar99);
            auVar96 = vfmadd231ps_avx512vl(auVar90,auVar97,auVar100);
            auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar97,auVar98);
            auVar99 = vfmadd231ps_avx512vl(auVar99,local_420,auVar97);
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar95,auVar91);
            vandps_avx512vl(auVar83,auVar91);
            auVar97 = vmaxps_avx(auVar91,auVar91);
            vandps_avx512vl(auVar94,auVar91);
            auVar97 = vmaxps_avx(auVar97,auVar91);
            auVar57._4_4_ = fStack_7bc;
            auVar57._0_4_ = local_7c0;
            auVar57._8_4_ = fStack_7b8;
            auVar57._12_4_ = fStack_7b4;
            auVar57._16_4_ = fStack_7b0;
            auVar57._20_4_ = fStack_7ac;
            auVar57._24_4_ = fStack_7a8;
            auVar57._28_4_ = fStack_7a4;
            uVar60 = vcmpps_avx512vl(auVar97,auVar57,1);
            bVar12 = (bool)((byte)uVar60 & 1);
            auVar109._0_4_ = (float)((uint)bVar12 * auVar84._0_4_ | (uint)!bVar12 * auVar95._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar95._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar95._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar95._12_4_);
            bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar109._16_4_ =
                 (float)((uint)bVar12 * auVar84._16_4_ | (uint)!bVar12 * auVar95._16_4_);
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar109._20_4_ =
                 (float)((uint)bVar12 * auVar84._20_4_ | (uint)!bVar12 * auVar95._20_4_);
            bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar109._24_4_ =
                 (float)((uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * auVar95._24_4_);
            bVar12 = SUB81(uVar60 >> 7,0);
            auVar109._28_4_ = (uint)bVar12 * auVar84._28_4_ | (uint)!bVar12 * auVar95._28_4_;
            bVar12 = (bool)((byte)uVar60 & 1);
            auVar110._0_4_ = (float)((uint)bVar12 * auVar85._0_4_ | (uint)!bVar12 * auVar83._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar83._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar83._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar83._12_4_);
            bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar12 * auVar85._16_4_ | (uint)!bVar12 * auVar83._16_4_);
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar12 * auVar85._20_4_ | (uint)!bVar12 * auVar83._20_4_);
            bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar12 * auVar85._24_4_ | (uint)!bVar12 * auVar83._24_4_);
            bVar12 = SUB81(uVar60 >> 7,0);
            auVar110._28_4_ = (uint)bVar12 * auVar85._28_4_ | (uint)!bVar12 * auVar83._28_4_;
            vandps_avx512vl(auVar96,auVar91);
            vandps_avx512vl(auVar90,auVar91);
            auVar97 = vmaxps_avx(auVar110,auVar110);
            vandps_avx512vl(auVar99,auVar91);
            auVar97 = vmaxps_avx(auVar97,auVar110);
            uVar60 = vcmpps_avx512vl(auVar97,auVar57,1);
            bVar12 = (bool)((byte)uVar60 & 1);
            auVar111._0_4_ = (uint)bVar12 * auVar84._0_4_ | (uint)!bVar12 * auVar96._0_4_;
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar111._4_4_ = (uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar96._4_4_;
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar111._8_4_ = (uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar96._8_4_;
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar111._12_4_ = (uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar96._12_4_;
            bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar111._16_4_ = (uint)bVar12 * auVar84._16_4_ | (uint)!bVar12 * auVar96._16_4_;
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar111._20_4_ = (uint)bVar12 * auVar84._20_4_ | (uint)!bVar12 * auVar96._20_4_;
            bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar111._24_4_ = (uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * auVar96._24_4_;
            bVar12 = SUB81(uVar60 >> 7,0);
            auVar111._28_4_ = (uint)bVar12 * auVar84._28_4_ | (uint)!bVar12 * auVar96._28_4_;
            bVar12 = (bool)((byte)uVar60 & 1);
            auVar112._0_4_ = (float)((uint)bVar12 * auVar85._0_4_ | (uint)!bVar12 * auVar90._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar90._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar90._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar90._12_4_);
            bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar112._16_4_ =
                 (float)((uint)bVar12 * auVar85._16_4_ | (uint)!bVar12 * auVar90._16_4_);
            bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar112._20_4_ =
                 (float)((uint)bVar12 * auVar85._20_4_ | (uint)!bVar12 * auVar90._20_4_);
            bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar112._24_4_ =
                 (float)((uint)bVar12 * auVar85._24_4_ | (uint)!bVar12 * auVar90._24_4_);
            bVar12 = SUB81(uVar60 >> 7,0);
            auVar112._28_4_ = (uint)bVar12 * auVar85._28_4_ | (uint)!bVar12 * auVar90._28_4_;
            auVar179._8_4_ = 0x80000000;
            auVar179._0_8_ = 0x8000000080000000;
            auVar179._12_4_ = 0x80000000;
            auVar179._16_4_ = 0x80000000;
            auVar179._20_4_ = 0x80000000;
            auVar179._24_4_ = 0x80000000;
            auVar179._28_4_ = 0x80000000;
            auVar97 = vxorps_avx512vl(auVar111,auVar179);
            auVar90 = auVar191._0_32_;
            auVar99 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar90);
            auVar76 = vfmadd231ps_fma(auVar99,auVar110,auVar110);
            auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
            auVar187._8_4_ = 0xbf000000;
            auVar187._0_8_ = 0xbf000000bf000000;
            auVar187._12_4_ = 0xbf000000;
            auVar187._16_4_ = 0xbf000000;
            auVar187._20_4_ = 0xbf000000;
            auVar187._24_4_ = 0xbf000000;
            auVar187._28_4_ = 0xbf000000;
            fVar155 = auVar99._0_4_;
            fVar162 = auVar99._4_4_;
            fVar163 = auVar99._8_4_;
            fVar164 = auVar99._12_4_;
            fVar143 = auVar99._16_4_;
            fVar154 = auVar99._20_4_;
            fVar68 = auVar99._24_4_;
            auVar38._4_4_ = fVar162 * fVar162 * fVar162 * auVar76._4_4_ * -0.5;
            auVar38._0_4_ = fVar155 * fVar155 * fVar155 * auVar76._0_4_ * -0.5;
            auVar38._8_4_ = fVar163 * fVar163 * fVar163 * auVar76._8_4_ * -0.5;
            auVar38._12_4_ = fVar164 * fVar164 * fVar164 * auVar76._12_4_ * -0.5;
            auVar38._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
            auVar38._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
            auVar38._24_4_ = fVar68 * fVar68 * fVar68 * -0.0;
            auVar38._28_4_ = auVar110._28_4_;
            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar99 = vfmadd231ps_avx512vl(auVar38,auVar96,auVar99);
            auVar39._4_4_ = auVar110._4_4_ * auVar99._4_4_;
            auVar39._0_4_ = auVar110._0_4_ * auVar99._0_4_;
            auVar39._8_4_ = auVar110._8_4_ * auVar99._8_4_;
            auVar39._12_4_ = auVar110._12_4_ * auVar99._12_4_;
            auVar39._16_4_ = auVar110._16_4_ * auVar99._16_4_;
            auVar39._20_4_ = auVar110._20_4_ * auVar99._20_4_;
            auVar39._24_4_ = auVar110._24_4_ * auVar99._24_4_;
            auVar39._28_4_ = 0;
            auVar40._4_4_ = auVar99._4_4_ * -auVar109._4_4_;
            auVar40._0_4_ = auVar99._0_4_ * -auVar109._0_4_;
            auVar40._8_4_ = auVar99._8_4_ * -auVar109._8_4_;
            auVar40._12_4_ = auVar99._12_4_ * -auVar109._12_4_;
            auVar40._16_4_ = auVar99._16_4_ * -auVar109._16_4_;
            auVar40._20_4_ = auVar99._20_4_ * -auVar109._20_4_;
            auVar40._24_4_ = auVar99._24_4_ * -auVar109._24_4_;
            auVar40._28_4_ = auVar110._28_4_;
            auVar95 = vmulps_avx512vl(auVar99,auVar90);
            auVar99 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar90);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,auVar112);
            auVar83 = vrsqrt14ps_avx512vl(auVar99);
            auVar99 = vmulps_avx512vl(auVar99,auVar187);
            fVar155 = auVar83._0_4_;
            fVar162 = auVar83._4_4_;
            fVar163 = auVar83._8_4_;
            fVar164 = auVar83._12_4_;
            fVar143 = auVar83._16_4_;
            fVar154 = auVar83._20_4_;
            fVar68 = auVar83._24_4_;
            auVar41._4_4_ = fVar162 * fVar162 * fVar162 * auVar99._4_4_;
            auVar41._0_4_ = fVar155 * fVar155 * fVar155 * auVar99._0_4_;
            auVar41._8_4_ = fVar163 * fVar163 * fVar163 * auVar99._8_4_;
            auVar41._12_4_ = fVar164 * fVar164 * fVar164 * auVar99._12_4_;
            auVar41._16_4_ = fVar143 * fVar143 * fVar143 * auVar99._16_4_;
            auVar41._20_4_ = fVar154 * fVar154 * fVar154 * auVar99._20_4_;
            auVar41._24_4_ = fVar68 * fVar68 * fVar68 * auVar99._24_4_;
            auVar41._28_4_ = auVar99._28_4_;
            auVar99 = vfmadd231ps_avx512vl(auVar41,auVar96,auVar83);
            auVar42._4_4_ = auVar112._4_4_ * auVar99._4_4_;
            auVar42._0_4_ = auVar112._0_4_ * auVar99._0_4_;
            auVar42._8_4_ = auVar112._8_4_ * auVar99._8_4_;
            auVar42._12_4_ = auVar112._12_4_ * auVar99._12_4_;
            auVar42._16_4_ = auVar112._16_4_ * auVar99._16_4_;
            auVar42._20_4_ = auVar112._20_4_ * auVar99._20_4_;
            auVar42._24_4_ = auVar112._24_4_ * auVar99._24_4_;
            auVar42._28_4_ = auVar83._28_4_;
            auVar43._4_4_ = auVar99._4_4_ * auVar97._4_4_;
            auVar43._0_4_ = auVar99._0_4_ * auVar97._0_4_;
            auVar43._8_4_ = auVar99._8_4_ * auVar97._8_4_;
            auVar43._12_4_ = auVar99._12_4_ * auVar97._12_4_;
            auVar43._16_4_ = auVar99._16_4_ * auVar97._16_4_;
            auVar43._20_4_ = auVar99._20_4_ * auVar97._20_4_;
            auVar43._24_4_ = auVar99._24_4_ * auVar97._24_4_;
            auVar43._28_4_ = auVar97._28_4_;
            auVar97 = vmulps_avx512vl(auVar99,auVar90);
            auVar76 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar75),auVar86);
            auVar99 = ZEXT1632(auVar75);
            auVar19 = vfmadd213ps_fma(auVar40,auVar99,auVar87);
            auVar96 = vfmadd213ps_avx512vl(auVar95,auVar99,auVar82);
            auVar83 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar70),auVar88);
            auVar21 = vfnmadd213ps_fma(auVar39,auVar99,auVar86);
            auVar94 = ZEXT1632(auVar70);
            auVar71 = vfmadd213ps_fma(auVar43,auVar94,auVar89);
            auVar79 = vfnmadd213ps_fma(auVar40,auVar99,auVar87);
            auVar78 = vfmadd213ps_fma(auVar97,auVar94,auVar81);
            auVar87 = ZEXT1632(auVar75);
            auVar80 = vfnmadd231ps_fma(auVar82,auVar87,auVar95);
            auVar74 = vfnmadd213ps_fma(auVar42,auVar94,auVar88);
            auVar73 = vfnmadd213ps_fma(auVar43,auVar94,auVar89);
            auVar128 = vfnmadd231ps_fma(auVar81,ZEXT1632(auVar70),auVar97);
            auVar81 = vsubps_avx512vl(auVar83,ZEXT1632(auVar21));
            auVar97 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar79));
            auVar99 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar80));
            auVar44._4_4_ = auVar97._4_4_ * auVar80._4_4_;
            auVar44._0_4_ = auVar97._0_4_ * auVar80._0_4_;
            auVar44._8_4_ = auVar97._8_4_ * auVar80._8_4_;
            auVar44._12_4_ = auVar97._12_4_ * auVar80._12_4_;
            auVar44._16_4_ = auVar97._16_4_ * 0.0;
            auVar44._20_4_ = auVar97._20_4_ * 0.0;
            auVar44._24_4_ = auVar97._24_4_ * 0.0;
            auVar44._28_4_ = auVar95._28_4_;
            auVar75 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar79),auVar99);
            auVar45._4_4_ = auVar99._4_4_ * auVar21._4_4_;
            auVar45._0_4_ = auVar99._0_4_ * auVar21._0_4_;
            auVar45._8_4_ = auVar99._8_4_ * auVar21._8_4_;
            auVar45._12_4_ = auVar99._12_4_ * auVar21._12_4_;
            auVar45._16_4_ = auVar99._16_4_ * 0.0;
            auVar45._20_4_ = auVar99._20_4_ * 0.0;
            auVar45._24_4_ = auVar99._24_4_ * 0.0;
            auVar45._28_4_ = auVar99._28_4_;
            auVar20 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar80),auVar81);
            auVar46._4_4_ = auVar79._4_4_ * auVar81._4_4_;
            auVar46._0_4_ = auVar79._0_4_ * auVar81._0_4_;
            auVar46._8_4_ = auVar79._8_4_ * auVar81._8_4_;
            auVar46._12_4_ = auVar79._12_4_ * auVar81._12_4_;
            auVar46._16_4_ = auVar81._16_4_ * 0.0;
            auVar46._20_4_ = auVar81._20_4_ * 0.0;
            auVar46._24_4_ = auVar81._24_4_ * 0.0;
            auVar46._28_4_ = auVar81._28_4_;
            auVar72 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar21),auVar97);
            auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),auVar90,ZEXT1632(auVar20));
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,ZEXT1632(auVar75));
            uVar60 = vcmpps_avx512vl(auVar97,auVar90,2);
            bVar62 = (byte)uVar60;
            fVar119 = (float)((uint)(bVar62 & 1) * auVar76._0_4_ |
                             (uint)!(bool)(bVar62 & 1) * auVar74._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            fVar121 = (float)((uint)bVar12 * auVar76._4_4_ | (uint)!bVar12 * auVar74._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            fVar124 = (float)((uint)bVar12 * auVar76._8_4_ | (uint)!bVar12 * auVar74._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            fVar125 = (float)((uint)bVar12 * auVar76._12_4_ | (uint)!bVar12 * auVar74._12_4_);
            auVar94 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar124,CONCAT44(fVar121,fVar119))));
            fVar120 = (float)((uint)(bVar62 & 1) * auVar19._0_4_ |
                             (uint)!(bool)(bVar62 & 1) * auVar73._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            fVar123 = (float)((uint)bVar12 * auVar19._4_4_ | (uint)!bVar12 * auVar73._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            fVar122 = (float)((uint)bVar12 * auVar19._8_4_ | (uint)!bVar12 * auVar73._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            fVar126 = (float)((uint)bVar12 * auVar19._12_4_ | (uint)!bVar12 * auVar73._12_4_);
            auVar84 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar122,CONCAT44(fVar123,fVar120))));
            auVar113._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar128._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar128._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar128._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar128._12_4_);
            fVar155 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar96._16_4_);
            auVar113._16_4_ = fVar155;
            fVar162 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar96._20_4_);
            auVar113._20_4_ = fVar162;
            fVar163 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar96._24_4_);
            auVar113._24_4_ = fVar163;
            iVar1 = (uint)(byte)(uVar60 >> 7) * auVar96._28_4_;
            auVar113._28_4_ = iVar1;
            auVar97 = vblendmps_avx512vl(ZEXT1632(auVar21),auVar83);
            auVar114._0_4_ =
                 (uint)(bVar62 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar75._0_4_;
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar114._4_4_ = (uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar75._4_4_;
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar114._8_4_ = (uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar75._8_4_;
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar114._12_4_ = (uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar75._12_4_;
            auVar114._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar97._16_4_;
            auVar114._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar97._20_4_;
            auVar114._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar97._24_4_;
            auVar114._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar97._28_4_;
            auVar97 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar71));
            auVar115._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar76._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar76._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar76._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar76._12_4_);
            fVar143 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar97._16_4_);
            auVar115._16_4_ = fVar143;
            fVar154 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar97._20_4_);
            auVar115._20_4_ = fVar154;
            fVar164 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar97._24_4_);
            auVar115._24_4_ = fVar164;
            auVar115._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar97._28_4_;
            auVar97 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar78));
            auVar116._0_4_ =
                 (float)((uint)(bVar62 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar62 & 1) * auVar19._0_4_);
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar19._4_4_);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar19._8_4_);
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar19._12_4_);
            fVar118 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar97._16_4_);
            auVar116._16_4_ = fVar118;
            fVar69 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar97._20_4_);
            auVar116._20_4_ = fVar69;
            fVar68 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar97._24_4_);
            auVar116._24_4_ = fVar68;
            iVar2 = (uint)(byte)(uVar60 >> 7) * auVar97._28_4_;
            auVar116._28_4_ = iVar2;
            auVar117._0_4_ =
                 (uint)(bVar62 & 1) * (int)auVar21._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar83._0_4_
            ;
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar12 * (int)auVar21._4_4_ | (uint)!bVar12 * auVar83._4_4_;
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar12 * (int)auVar21._8_4_ | (uint)!bVar12 * auVar83._8_4_;
            bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar12 * (int)auVar21._12_4_ | (uint)!bVar12 * auVar83._12_4_;
            auVar117._16_4_ = (uint)!(bool)((byte)(uVar60 >> 4) & 1) * auVar83._16_4_;
            auVar117._20_4_ = (uint)!(bool)((byte)(uVar60 >> 5) & 1) * auVar83._20_4_;
            auVar117._24_4_ = (uint)!(bool)((byte)(uVar60 >> 6) & 1) * auVar83._24_4_;
            auVar117._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar83._28_4_;
            bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar60 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar83 = vsubps_avx512vl(auVar117,auVar94);
            auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar79._12_4_ |
                                                    (uint)!bVar16 * auVar71._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar79._8_4_ |
                                                             (uint)!bVar14 * auVar71._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar79._4_4_ |
                                                                      (uint)!bVar12 * auVar71._4_4_,
                                                                      (uint)(bVar62 & 1) *
                                                                      (int)auVar79._0_4_ |
                                                                      (uint)!(bool)(bVar62 & 1) *
                                                                      auVar71._0_4_)))),auVar84);
            auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar80._12_4_ |
                                                    (uint)!bVar17 * auVar78._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar80._8_4_ |
                                                             (uint)!bVar15 * auVar78._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar80._4_4_ |
                                                                      (uint)!bVar13 * auVar78._4_4_,
                                                                      (uint)(bVar62 & 1) *
                                                                      (int)auVar80._0_4_ |
                                                                      (uint)!(bool)(bVar62 & 1) *
                                                                      auVar78._0_4_)))),auVar113);
            auVar95 = vsubps_avx(auVar94,auVar114);
            auVar81 = vsubps_avx(auVar84,auVar115);
            auVar82 = vsubps_avx(auVar113,auVar116);
            auVar47._4_4_ = auVar96._4_4_ * fVar121;
            auVar47._0_4_ = auVar96._0_4_ * fVar119;
            auVar47._8_4_ = auVar96._8_4_ * fVar124;
            auVar47._12_4_ = auVar96._12_4_ * fVar125;
            auVar47._16_4_ = auVar96._16_4_ * 0.0;
            auVar47._20_4_ = auVar96._20_4_ * 0.0;
            auVar47._24_4_ = auVar96._24_4_ * 0.0;
            auVar47._28_4_ = 0;
            auVar75 = vfmsub231ps_fma(auVar47,auVar113,auVar83);
            auVar153._0_4_ = fVar120 * auVar83._0_4_;
            auVar153._4_4_ = fVar123 * auVar83._4_4_;
            auVar153._8_4_ = fVar122 * auVar83._8_4_;
            auVar153._12_4_ = fVar126 * auVar83._12_4_;
            auVar153._16_4_ = auVar83._16_4_ * 0.0;
            auVar153._20_4_ = auVar83._20_4_ * 0.0;
            auVar153._24_4_ = auVar83._24_4_ * 0.0;
            auVar153._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar153,auVar94,auVar99);
            auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar90,ZEXT1632(auVar75));
            auVar160._0_4_ = auVar99._0_4_ * auVar113._0_4_;
            auVar160._4_4_ = auVar99._4_4_ * auVar113._4_4_;
            auVar160._8_4_ = auVar99._8_4_ * auVar113._8_4_;
            auVar160._12_4_ = auVar99._12_4_ * auVar113._12_4_;
            auVar160._16_4_ = auVar99._16_4_ * fVar155;
            auVar160._20_4_ = auVar99._20_4_ * fVar162;
            auVar160._24_4_ = auVar99._24_4_ * fVar163;
            auVar160._28_4_ = 0;
            auVar75 = vfmsub231ps_fma(auVar160,auVar84,auVar96);
            auVar85 = vfmadd231ps_avx512vl(auVar97,auVar90,ZEXT1632(auVar75));
            auVar97 = vmulps_avx512vl(auVar82,auVar114);
            auVar97 = vfmsub231ps_avx512vl(auVar97,auVar95,auVar116);
            auVar48._4_4_ = auVar81._4_4_ * auVar116._4_4_;
            auVar48._0_4_ = auVar81._0_4_ * auVar116._0_4_;
            auVar48._8_4_ = auVar81._8_4_ * auVar116._8_4_;
            auVar48._12_4_ = auVar81._12_4_ * auVar116._12_4_;
            auVar48._16_4_ = auVar81._16_4_ * fVar118;
            auVar48._20_4_ = auVar81._20_4_ * fVar69;
            auVar48._24_4_ = auVar81._24_4_ * fVar68;
            auVar48._28_4_ = iVar2;
            auVar75 = vfmsub231ps_fma(auVar48,auVar115,auVar82);
            auVar161._0_4_ = auVar115._0_4_ * auVar95._0_4_;
            auVar161._4_4_ = auVar115._4_4_ * auVar95._4_4_;
            auVar161._8_4_ = auVar115._8_4_ * auVar95._8_4_;
            auVar161._12_4_ = auVar115._12_4_ * auVar95._12_4_;
            auVar161._16_4_ = fVar143 * auVar95._16_4_;
            auVar161._20_4_ = fVar154 * auVar95._20_4_;
            auVar161._24_4_ = fVar164 * auVar95._24_4_;
            auVar161._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar161,auVar81,auVar114);
            auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar90,auVar97);
            auVar86 = vfmadd231ps_avx512vl(auVar97,auVar90,ZEXT1632(auVar75));
            auVar97 = vmaxps_avx(auVar85,auVar86);
            uVar136 = vcmpps_avx512vl(auVar97,auVar90,2);
            local_6f0 = local_6f0 & (byte)uVar136;
            if (local_6f0 == 0) {
LAB_01b6e7d1:
              local_6f0 = 0;
            }
            else {
              auVar49._4_4_ = auVar82._4_4_ * auVar99._4_4_;
              auVar49._0_4_ = auVar82._0_4_ * auVar99._0_4_;
              auVar49._8_4_ = auVar82._8_4_ * auVar99._8_4_;
              auVar49._12_4_ = auVar82._12_4_ * auVar99._12_4_;
              auVar49._16_4_ = auVar82._16_4_ * auVar99._16_4_;
              auVar49._20_4_ = auVar82._20_4_ * auVar99._20_4_;
              auVar49._24_4_ = auVar82._24_4_ * auVar99._24_4_;
              auVar49._28_4_ = auVar97._28_4_;
              auVar19 = vfmsub231ps_fma(auVar49,auVar81,auVar96);
              auVar50._4_4_ = auVar96._4_4_ * auVar95._4_4_;
              auVar50._0_4_ = auVar96._0_4_ * auVar95._0_4_;
              auVar50._8_4_ = auVar96._8_4_ * auVar95._8_4_;
              auVar50._12_4_ = auVar96._12_4_ * auVar95._12_4_;
              auVar50._16_4_ = auVar96._16_4_ * auVar95._16_4_;
              auVar50._20_4_ = auVar96._20_4_ * auVar95._20_4_;
              auVar50._24_4_ = auVar96._24_4_ * auVar95._24_4_;
              auVar50._28_4_ = auVar96._28_4_;
              auVar76 = vfmsub231ps_fma(auVar50,auVar83,auVar82);
              auVar51._4_4_ = auVar81._4_4_ * auVar83._4_4_;
              auVar51._0_4_ = auVar81._0_4_ * auVar83._0_4_;
              auVar51._8_4_ = auVar81._8_4_ * auVar83._8_4_;
              auVar51._12_4_ = auVar81._12_4_ * auVar83._12_4_;
              auVar51._16_4_ = auVar81._16_4_ * auVar83._16_4_;
              auVar51._20_4_ = auVar81._20_4_ * auVar83._20_4_;
              auVar51._24_4_ = auVar81._24_4_ * auVar83._24_4_;
              auVar51._28_4_ = auVar81._28_4_;
              auVar71 = vfmsub231ps_fma(auVar51,auVar95,auVar99);
              auVar75 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar71));
              auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar19),auVar90);
              auVar99 = vrcp14ps_avx512vl(auVar97);
              auVar28._8_4_ = 0x3f800000;
              auVar28._0_8_ = &DAT_3f8000003f800000;
              auVar28._12_4_ = 0x3f800000;
              auVar28._16_4_ = 0x3f800000;
              auVar28._20_4_ = 0x3f800000;
              auVar28._24_4_ = 0x3f800000;
              auVar28._28_4_ = 0x3f800000;
              auVar96 = vfnmadd213ps_avx512vl(auVar99,auVar97,auVar28);
              auVar75 = vfmadd132ps_fma(auVar96,auVar99,auVar99);
              auVar52._4_4_ = auVar71._4_4_ * auVar113._4_4_;
              auVar52._0_4_ = auVar71._0_4_ * auVar113._0_4_;
              auVar52._8_4_ = auVar71._8_4_ * auVar113._8_4_;
              auVar52._12_4_ = auVar71._12_4_ * auVar113._12_4_;
              auVar52._16_4_ = fVar155 * 0.0;
              auVar52._20_4_ = fVar162 * 0.0;
              auVar52._24_4_ = fVar163 * 0.0;
              auVar52._28_4_ = iVar1;
              auVar76 = vfmadd231ps_fma(auVar52,auVar84,ZEXT1632(auVar76));
              auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar94,ZEXT1632(auVar19));
              fVar155 = auVar75._0_4_;
              fVar162 = auVar75._4_4_;
              fVar163 = auVar75._8_4_;
              fVar164 = auVar75._12_4_;
              auVar99 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar164,
                                           CONCAT48(auVar76._8_4_ * fVar163,
                                                    CONCAT44(auVar76._4_4_ * fVar162,
                                                             auVar76._0_4_ * fVar155))));
              auVar58._4_4_ = uStack_63c;
              auVar58._0_4_ = local_640;
              auVar58._8_4_ = uStack_638;
              auVar58._12_4_ = uStack_634;
              auVar58._16_4_ = uStack_630;
              auVar58._20_4_ = uStack_62c;
              auVar58._24_4_ = uStack_628;
              auVar58._28_4_ = uStack_624;
              uVar136 = vcmpps_avx512vl(auVar99,auVar58,0xd);
              uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar29._4_4_ = uVar127;
              auVar29._0_4_ = uVar127;
              auVar29._8_4_ = uVar127;
              auVar29._12_4_ = uVar127;
              auVar29._16_4_ = uVar127;
              auVar29._20_4_ = uVar127;
              auVar29._24_4_ = uVar127;
              auVar29._28_4_ = uVar127;
              uVar22 = vcmpps_avx512vl(auVar99,auVar29,2);
              local_6f0 = (byte)uVar136 & (byte)uVar22 & local_6f0;
              if (local_6f0 == 0) goto LAB_01b6e7d1;
              uVar136 = vcmpps_avx512vl(auVar97,auVar90,4);
              if ((local_6f0 & (byte)uVar136) == 0) {
                local_6f0 = 0;
              }
              else {
                local_6f0 = local_6f0 & (byte)uVar136;
                fVar143 = auVar85._0_4_ * fVar155;
                fVar154 = auVar85._4_4_ * fVar162;
                auVar53._4_4_ = fVar154;
                auVar53._0_4_ = fVar143;
                fVar68 = auVar85._8_4_ * fVar163;
                auVar53._8_4_ = fVar68;
                fVar69 = auVar85._12_4_ * fVar164;
                auVar53._12_4_ = fVar69;
                fVar118 = auVar85._16_4_ * 0.0;
                auVar53._16_4_ = fVar118;
                fVar119 = auVar85._20_4_ * 0.0;
                auVar53._20_4_ = fVar119;
                fVar120 = auVar85._24_4_ * 0.0;
                auVar53._24_4_ = fVar120;
                auVar53._28_4_ = auVar85._28_4_;
                fVar155 = auVar86._0_4_ * fVar155;
                fVar162 = auVar86._4_4_ * fVar162;
                auVar54._4_4_ = fVar162;
                auVar54._0_4_ = fVar155;
                fVar163 = auVar86._8_4_ * fVar163;
                auVar54._8_4_ = fVar163;
                fVar164 = auVar86._12_4_ * fVar164;
                auVar54._12_4_ = fVar164;
                fVar121 = auVar86._16_4_ * 0.0;
                auVar54._16_4_ = fVar121;
                fVar123 = auVar86._20_4_ * 0.0;
                auVar54._20_4_ = fVar123;
                fVar124 = auVar86._24_4_ * 0.0;
                auVar54._24_4_ = fVar124;
                auVar54._28_4_ = auVar86._28_4_;
                auVar169._8_4_ = 0x3f800000;
                auVar169._0_8_ = &DAT_3f8000003f800000;
                auVar169._12_4_ = 0x3f800000;
                auVar169._16_4_ = 0x3f800000;
                auVar169._20_4_ = 0x3f800000;
                auVar169._24_4_ = 0x3f800000;
                auVar169._28_4_ = 0x3f800000;
                auVar97 = vsubps_avx512vl(auVar169,auVar53);
                bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar60 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar60 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar60 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar60 >> 6) & 1);
                bVar18 = SUB81(uVar60 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar18 * auVar85._28_4_ |
                                              (uint)!bVar18 * auVar97._28_4_,
                                              CONCAT424((uint)bVar17 * (int)fVar120 |
                                                        (uint)!bVar17 * auVar97._24_4_,
                                                        CONCAT420((uint)bVar16 * (int)fVar119 |
                                                                  (uint)!bVar16 * auVar97._20_4_,
                                                                  CONCAT416((uint)bVar15 *
                                                                            (int)fVar118 |
                                                                            (uint)!bVar15 *
                                                                            auVar97._16_4_,
                                                                            CONCAT412((uint)bVar14 *
                                                                                      (int)fVar69 |
                                                                                      (uint)!bVar14
                                                                                      * auVar97.
                                                  _12_4_,CONCAT48((uint)bVar13 * (int)fVar68 |
                                                                  (uint)!bVar13 * auVar97._8_4_,
                                                                  CONCAT44((uint)bVar12 *
                                                                           (int)fVar154 |
                                                                           (uint)!bVar12 *
                                                                           auVar97._4_4_,
                                                                           (uint)(bVar62 & 1) *
                                                                           (int)fVar143 |
                                                                           (uint)!(bool)(bVar62 & 1)
                                                                           * auVar97._0_4_))))))));
                auVar97 = vsubps_avx(auVar169,auVar54);
                bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar60 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar60 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar60 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar60 >> 6) & 1);
                bVar18 = SUB81(uVar60 >> 7,0);
                local_620._4_4_ = (uint)bVar12 * (int)fVar162 | (uint)!bVar12 * auVar97._4_4_;
                local_620._0_4_ =
                     (uint)(bVar62 & 1) * (int)fVar155 | (uint)!(bool)(bVar62 & 1) * auVar97._0_4_;
                local_620._8_4_ = (uint)bVar13 * (int)fVar163 | (uint)!bVar13 * auVar97._8_4_;
                local_620._12_4_ = (uint)bVar14 * (int)fVar164 | (uint)!bVar14 * auVar97._12_4_;
                local_620._16_4_ = (uint)bVar15 * (int)fVar121 | (uint)!bVar15 * auVar97._16_4_;
                local_620._20_4_ = (uint)bVar16 * (int)fVar123 | (uint)!bVar16 * auVar97._20_4_;
                local_620._24_4_ = (uint)bVar17 * (int)fVar124 | (uint)!bVar17 * auVar97._24_4_;
                local_620._28_4_ = (uint)bVar18 * auVar86._28_4_ | (uint)!bVar18 * auVar97._28_4_;
                auVar189 = ZEXT3264(auVar99);
              }
            }
            auVar188 = ZEXT3264(local_8a0);
            auVar135 = ZEXT3264(local_8c0);
            if (local_6f0 != 0) {
              auVar97 = vsubps_avx(ZEXT1632(auVar70),auVar87);
              local_820 = in_ZMM20._0_32_;
              auVar97 = vfmadd213ps_avx512vl(auVar97,local_820,auVar87);
              auVar133._0_4_ = auVar97._0_4_ + auVar97._0_4_;
              auVar133._4_4_ = auVar97._4_4_ + auVar97._4_4_;
              auVar133._8_4_ = auVar97._8_4_ + auVar97._8_4_;
              auVar133._12_4_ = auVar97._12_4_ + auVar97._12_4_;
              auVar133._16_4_ = auVar97._16_4_ + auVar97._16_4_;
              auVar133._20_4_ = auVar97._20_4_ + auVar97._20_4_;
              auVar133._24_4_ = auVar97._24_4_ + auVar97._24_4_;
              auVar133._28_4_ = auVar97._28_4_ + auVar97._28_4_;
              uVar127 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar30._4_4_ = uVar127;
              auVar30._0_4_ = uVar127;
              auVar30._8_4_ = uVar127;
              auVar30._12_4_ = uVar127;
              auVar30._16_4_ = uVar127;
              auVar30._20_4_ = uVar127;
              auVar30._24_4_ = uVar127;
              auVar30._28_4_ = uVar127;
              auVar97 = vmulps_avx512vl(auVar133,auVar30);
              local_840 = auVar189._0_32_;
              uVar136 = vcmpps_avx512vl(local_840,auVar97,6);
              local_6f0 = local_6f0 & (byte)uVar136;
              if (local_6f0 != 0) {
                auVar134._8_4_ = 0xbf800000;
                auVar134._0_8_ = 0xbf800000bf800000;
                auVar134._12_4_ = 0xbf800000;
                auVar134._16_4_ = 0xbf800000;
                auVar134._20_4_ = 0xbf800000;
                auVar134._24_4_ = 0xbf800000;
                auVar134._28_4_ = 0xbf800000;
                auVar31._8_4_ = 0x40000000;
                auVar31._0_8_ = 0x4000000040000000;
                auVar31._12_4_ = 0x40000000;
                auVar31._16_4_ = 0x40000000;
                auVar31._20_4_ = 0x40000000;
                auVar31._24_4_ = 0x40000000;
                auVar31._28_4_ = 0x40000000;
                local_780 = vfmadd132ps_avx512vl(local_620,auVar134,auVar31);
                local_620 = local_780;
                auVar97 = local_620;
                local_740 = (undefined4)lVar66;
                local_720 = local_8d0;
                uStack_718 = uStack_8c8;
                local_710 = local_8e0;
                uStack_708 = uStack_8d8;
                local_700 = local_880;
                uStack_6f8 = uStack_878;
                pGVar10 = (context->scene->geometries).items[uVar65].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                  bVar62 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar62 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar99 = vaddps_avx512vl(local_820,_DAT_02020f40);
                  auVar75 = vcvtsi2ss_avx512f(local_360._0_16_,local_740);
                  fVar155 = auVar75._0_4_;
                  local_6e0[0] = (fVar155 + auVar99._0_4_) * (float)local_4c0._0_4_;
                  local_6e0[1] = (fVar155 + auVar99._4_4_) * (float)local_4c0._4_4_;
                  local_6e0[2] = (fVar155 + auVar99._8_4_) * fStack_4b8;
                  local_6e0[3] = (fVar155 + auVar99._12_4_) * fStack_4b4;
                  fStack_6d0 = (fVar155 + auVar99._16_4_) * fStack_4b0;
                  fStack_6cc = (fVar155 + auVar99._20_4_) * fStack_4ac;
                  fStack_6c8 = (fVar155 + auVar99._24_4_) * fStack_4a8;
                  fStack_6c4 = fVar155 + auVar99._28_4_;
                  local_620._0_8_ = local_780._0_8_;
                  local_620._8_8_ = local_780._8_8_;
                  local_620._16_8_ = local_780._16_8_;
                  local_620._24_8_ = local_780._24_8_;
                  local_6c0 = local_620._0_8_;
                  uStack_6b8 = local_620._8_8_;
                  uStack_6b0 = local_620._16_8_;
                  uStack_6a8 = local_620._24_8_;
                  local_6a0 = local_840;
                  local_920._8_8_ = uStack_8c8;
                  local_920._0_8_ = local_8d0;
                  uVar60 = 0;
                  local_8f0 = (ulong)local_6f0;
                  for (uVar64 = local_8f0; (uVar64 & 1) == 0;
                      uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                    uVar60 = uVar60 + 1;
                  }
                  local_5c0 = local_8e0;
                  uStack_5b8 = uStack_8d8;
                  local_5d0 = local_880;
                  uStack_5c8 = uStack_878;
                  local_910 = CONCAT44(local_910._4_4_,1);
                  local_7a0 = local_820;
                  local_760 = local_840;
                  local_73c = iVar9;
                  local_730 = auVar77;
                  local_620 = auVar97;
                  do {
                    local_900 = *(undefined4 *)(ray + k * 4 + 0x200);
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_6e0[uVar60]));
                    local_1c0 = vbroadcastss_avx512f
                                          (ZEXT416(*(uint *)((long)&local_6c0 + uVar60 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_6a0 + uVar60 * 4);
                    local_950.context = context->user;
                    fVar162 = local_200._0_4_;
                    fVar155 = 1.0 - fVar162;
                    auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar162 * (fVar155 + fVar155))),
                                               ZEXT416((uint)fVar155),ZEXT416((uint)fVar155));
                    auVar76 = local_200._0_16_;
                    auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                              ZEXT416(0xc0a00000));
                    auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162 * 3.0)),
                                              ZEXT416((uint)(fVar162 + fVar162)),auVar75);
                    auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                              ZEXT416(0x40000000));
                    auVar75 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * fVar155 * -3.0)),
                                              ZEXT416((uint)(fVar155 + fVar155)),auVar75);
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),auVar76,
                                              ZEXT416((uint)(fVar155 * -2.0)));
                    fVar155 = auVar19._0_4_ * 0.5;
                    fVar162 = auVar70._0_4_ * 0.5;
                    fVar163 = auVar75._0_4_ * 0.5;
                    fVar164 = auVar76._0_4_ * 0.5;
                    auVar151._0_4_ = fVar164 * (float)local_5d0;
                    auVar151._4_4_ = fVar164 * local_5d0._4_4_;
                    auVar151._8_4_ = fVar164 * (float)uStack_5c8;
                    auVar151._12_4_ = fVar164 * uStack_5c8._4_4_;
                    auVar167._4_4_ = fVar163;
                    auVar167._0_4_ = fVar163;
                    auVar167._8_4_ = fVar163;
                    auVar167._12_4_ = fVar163;
                    auVar59._8_8_ = uStack_5b8;
                    auVar59._0_8_ = local_5c0;
                    auVar75 = vfmadd132ps_fma(auVar167,auVar151,auVar59);
                    auVar152._4_4_ = fVar162;
                    auVar152._0_4_ = fVar162;
                    auVar152._8_4_ = fVar162;
                    auVar152._12_4_ = fVar162;
                    auVar75 = vfmadd132ps_fma(auVar152,auVar75,local_920);
                    auVar131._4_4_ = fVar155;
                    auVar131._0_4_ = fVar155;
                    auVar131._8_4_ = fVar155;
                    auVar131._12_4_ = fVar155;
                    auVar75 = vfmadd213ps_fma(auVar131,auVar77,auVar75);
                    auVar142 = vbroadcastss_avx512f(auVar75);
                    auVar172 = vbroadcastss_avx512f(ZEXT416(1));
                    local_280 = vpermps_avx512f(auVar172,ZEXT1664(auVar75));
                    auVar172 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar172,ZEXT1664(auVar75));
                    local_2c0[0] = (RTCHitN)auVar142[0];
                    local_2c0[1] = (RTCHitN)auVar142[1];
                    local_2c0[2] = (RTCHitN)auVar142[2];
                    local_2c0[3] = (RTCHitN)auVar142[3];
                    local_2c0[4] = (RTCHitN)auVar142[4];
                    local_2c0[5] = (RTCHitN)auVar142[5];
                    local_2c0[6] = (RTCHitN)auVar142[6];
                    local_2c0[7] = (RTCHitN)auVar142[7];
                    local_2c0[8] = (RTCHitN)auVar142[8];
                    local_2c0[9] = (RTCHitN)auVar142[9];
                    local_2c0[10] = (RTCHitN)auVar142[10];
                    local_2c0[0xb] = (RTCHitN)auVar142[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar142[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar142[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar142[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar142[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar142[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar142[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar142[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar142[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar142[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar142[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar142[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar142[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar142[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar142[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar142[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar142[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar142[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar142[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar142[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar142[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar142[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar142[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar142[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar142[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar142[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar142[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar142[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar142[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar142[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar142[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar142[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar142[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar142[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar142[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar142[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar142[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar142[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar142[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar142[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar142[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar142[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar142[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar142[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar142[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar142[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar142[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar142[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar142[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar142[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar142[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar142[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar142[0x3f];
                    local_180 = local_540._0_8_;
                    uStack_178 = local_540._8_8_;
                    uStack_170 = local_540._16_8_;
                    uStack_168 = local_540._24_8_;
                    uStack_160 = local_540._32_8_;
                    uStack_158 = local_540._40_8_;
                    uStack_150 = local_540._48_8_;
                    uStack_148 = local_540._56_8_;
                    auVar142 = vmovdqa64_avx512f(local_500);
                    local_140 = vmovdqa64_avx512f(auVar142);
                    vpcmpeqd_avx2(auVar142._0_32_,auVar142._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_950.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_950.context)->instPrimID[0]));
                    local_680 = local_300;
                    local_950.valid = (int *)local_680;
                    local_950.geometryUserPtr = pGVar10->userPtr;
                    local_950.hit = local_2c0;
                    local_950.N = 0x10;
                    pRVar61 = (RayK<16> *)pGVar10->occlusionFilterN;
                    local_580._0_8_ = uVar60;
                    uVar64 = uVar60;
                    local_950.ray = (RTCRayN *)ray;
                    if (pRVar61 != (RayK<16> *)0x0) {
                      pRVar61 = (RayK<16> *)(*(code *)pRVar61)(&local_950);
                      uVar64 = local_580._0_8_;
                    }
                    auVar142 = vmovdqa64_avx512f(local_680);
                    uVar136 = vptestmd_avx512f(auVar142,auVar142);
                    if ((short)uVar136 != 0) {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&local_950);
                        uVar64 = local_580._0_8_;
                      }
                      auVar75 = auVar191._0_16_;
                      auVar142 = vmovdqa64_avx512f(local_680);
                      uVar60 = vptestmd_avx512f(auVar142,auVar142);
                      auVar142 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar12 = (bool)((byte)uVar60 & 1);
                      auVar172._0_4_ =
                           (uint)bVar12 * auVar142._0_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x200);
                      bVar12 = (bool)((byte)(uVar60 >> 1) & 1);
                      auVar172._4_4_ =
                           (uint)bVar12 * auVar142._4_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x204);
                      bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
                      auVar172._8_4_ =
                           (uint)bVar12 * auVar142._8_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x208);
                      bVar12 = (bool)((byte)(uVar60 >> 3) & 1);
                      auVar172._12_4_ =
                           (uint)bVar12 * auVar142._12_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x20c);
                      bVar12 = (bool)((byte)(uVar60 >> 4) & 1);
                      auVar172._16_4_ =
                           (uint)bVar12 * auVar142._16_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x210);
                      bVar12 = (bool)((byte)(uVar60 >> 5) & 1);
                      auVar172._20_4_ =
                           (uint)bVar12 * auVar142._20_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x214);
                      bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
                      auVar172._24_4_ =
                           (uint)bVar12 * auVar142._24_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x218);
                      bVar12 = (bool)((byte)(uVar60 >> 7) & 1);
                      auVar172._28_4_ =
                           (uint)bVar12 * auVar142._28_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x21c);
                      bVar12 = (bool)((byte)(uVar60 >> 8) & 1);
                      auVar172._32_4_ =
                           (uint)bVar12 * auVar142._32_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x220);
                      bVar12 = (bool)((byte)(uVar60 >> 9) & 1);
                      auVar172._36_4_ =
                           (uint)bVar12 * auVar142._36_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x224);
                      bVar12 = (bool)((byte)(uVar60 >> 10) & 1);
                      auVar172._40_4_ =
                           (uint)bVar12 * auVar142._40_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x228);
                      bVar12 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      auVar172._44_4_ =
                           (uint)bVar12 * auVar142._44_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x22c);
                      bVar12 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      auVar172._48_4_ =
                           (uint)bVar12 * auVar142._48_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x230);
                      bVar12 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      auVar172._52_4_ =
                           (uint)bVar12 * auVar142._52_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x234);
                      bVar12 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      auVar172._56_4_ =
                           (uint)bVar12 * auVar142._56_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x238);
                      bVar12 = SUB81(uVar60 >> 0xf,0);
                      auVar172._60_4_ =
                           (uint)bVar12 * auVar142._60_4_ |
                           (uint)!bVar12 * *(int *)(local_950.ray + 0x23c);
                      *(undefined1 (*) [64])(local_950.ray + 0x200) = auVar172;
                      pRVar61 = (RayK<16> *)local_950.ray;
                      if ((short)uVar60 != 0) break;
                    }
                    auVar75 = auVar191._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_900;
                    uVar60 = 0;
                    local_8f0 = local_8f0 ^ 1L << (uVar64 & 0x3f);
                    for (uVar64 = local_8f0; (uVar64 & 1) == 0;
                        uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                      uVar60 = uVar60 + 1;
                    }
                    local_910 = CONCAT44(local_910._4_4_,
                                         (int)CONCAT71((int7)((ulong)pRVar61 >> 8),local_8f0 != 0));
                  } while (local_8f0 != 0);
                  bVar62 = (byte)local_910 & 1;
                  auVar75 = vxorps_avx512vl(auVar75,auVar75);
                  auVar191 = ZEXT1664(auVar75);
                  in_ZMM20 = ZEXT3264(local_820);
                  auVar189 = ZEXT3264(local_840);
                  auVar190 = ZEXT3264(local_7e0);
                  auVar188 = ZEXT3264(local_8a0);
                  auVar135 = ZEXT3264(local_8c0);
                }
                bVar63 = (bool)(bVar63 | bVar62);
              }
            }
          }
          auVar172 = ZEXT3264(auVar141);
          auVar142 = ZEXT3264(auVar108);
          local_840 = auVar189._0_32_;
          lVar66 = lVar66 + 8;
        } while ((int)lVar66 < iVar9);
      }
      if (bVar63 != false) {
        return local_9d9;
      }
      uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar24._4_4_ = uVar127;
      auVar24._0_4_ = uVar127;
      auVar24._8_4_ = uVar127;
      auVar24._12_4_ = uVar127;
      uVar136 = vcmpps_avx512vl(local_5b0,auVar24,2);
      uVar65 = (uint)uVar67 & (uint)uVar136;
      uVar67 = (ulong)uVar65;
      local_9d9 = uVar65 != 0;
    } while (local_9d9);
  }
  return local_9d9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }